

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersector1<4>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  undefined1 auVar56 [12];
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  uint uVar90;
  ulong uVar91;
  uint uVar92;
  ulong uVar93;
  undefined4 uVar94;
  ulong uVar95;
  long lVar96;
  bool bVar97;
  float fVar98;
  float fVar130;
  float fVar131;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar132;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 extraout_var [60];
  undefined1 auVar129 [64];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar162;
  float fVar178;
  float fVar179;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar180;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  vint4 ai_2;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar200;
  float fVar213;
  float fVar214;
  vint4 ai;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar215;
  float fVar217;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar216;
  undefined1 auVar209 [32];
  undefined1 auVar208 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  vint4 bi;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar235;
  undefined1 auVar234 [64];
  vint4 ai_1;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [16];
  float fVar252;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [64];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar262;
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar263 [16];
  undefined1 auVar265 [32];
  undefined1 auVar264 [16];
  undefined1 auVar266 [64];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar267;
  undefined1 auVar274 [32];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar275 [64];
  undefined4 uVar284;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar281 [32];
  undefined4 uVar286;
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b0c;
  ulong local_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined8 local_9b0;
  float local_9a8;
  float local_9a4;
  undefined4 local_9a0;
  uint local_99c;
  uint local_998;
  uint local_994;
  uint local_990;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined1 auStack_970 [16];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined1 local_7f0 [16];
  Primitive *local_7d8;
  Primitive *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined4 local_7a0;
  undefined4 uStack_79c;
  undefined4 uStack_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 uStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  uint uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined4 local_380;
  undefined4 uStack_37c;
  undefined4 uStack_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar4 = prim[1];
  uVar95 = (ulong)(byte)PVar4;
  lVar96 = uVar95 * 0x19;
  fVar200 = *(float *)(prim + lVar96 + 0x12);
  auVar109 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar96 + 6));
  auVar99._0_4_ = fVar200 * auVar109._0_4_;
  auVar99._4_4_ = fVar200 * auVar109._4_4_;
  auVar99._8_4_ = fVar200 * auVar109._8_4_;
  auVar99._12_4_ = fVar200 * auVar109._12_4_;
  auVar218._0_4_ = fVar200 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar218._4_4_ = fVar200 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar218._8_4_ = fVar200 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar218._12_4_ = fVar200 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 4 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar246 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 5 + 6)));
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar258 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 6 + 6)));
  auVar258 = vcvtdq2ps_avx(auVar258);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar95 * 0xb + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar95 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  uVar91 = (ulong)(uint)((int)(uVar95 * 9) * 2);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + uVar95 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar275 = ZEXT1664(auVar101);
  uVar91 = (ulong)(uint)((int)(uVar95 * 5) << 2);
  auVar163 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar290._4_4_ = auVar218._0_4_;
  auVar290._0_4_ = auVar218._0_4_;
  auVar290._8_4_ = auVar218._0_4_;
  auVar290._12_4_ = auVar218._0_4_;
  auVar137 = vshufps_avx(auVar218,auVar218,0x55);
  auVar100 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar200 = auVar100._0_4_;
  auVar263._0_4_ = fVar200 * auVar258._0_4_;
  fVar213 = auVar100._4_4_;
  auVar263._4_4_ = fVar213 * auVar258._4_4_;
  fVar214 = auVar100._8_4_;
  auVar263._8_4_ = fVar214 * auVar258._8_4_;
  fVar216 = auVar100._12_4_;
  auVar263._12_4_ = fVar216 * auVar258._12_4_;
  auVar256._0_4_ = auVar8._0_4_ * fVar200;
  auVar256._4_4_ = auVar8._4_4_ * fVar213;
  auVar256._8_4_ = auVar8._8_4_ * fVar214;
  auVar256._12_4_ = auVar8._12_4_ * fVar216;
  auVar236._0_4_ = auVar163._0_4_ * fVar200;
  auVar236._4_4_ = auVar163._4_4_ * fVar213;
  auVar236._8_4_ = auVar163._8_4_ * fVar214;
  auVar236._12_4_ = auVar163._12_4_ * fVar216;
  auVar100 = vfmadd231ps_fma(auVar263,auVar137,auVar246);
  auVar138 = vfmadd231ps_fma(auVar256,auVar137,auVar7);
  auVar137 = vfmadd231ps_fma(auVar236,auVar101,auVar137);
  auVar181 = vfmadd231ps_fma(auVar100,auVar290,auVar109);
  auVar266 = ZEXT1664(auVar181);
  auVar138 = vfmadd231ps_fma(auVar138,auVar290,auVar141);
  auVar261 = ZEXT1664(auVar138);
  auVar202 = vfmadd231ps_fma(auVar137,auVar102,auVar290);
  auVar291._4_4_ = auVar99._0_4_;
  auVar291._0_4_ = auVar99._0_4_;
  auVar291._8_4_ = auVar99._0_4_;
  auVar291._12_4_ = auVar99._0_4_;
  auVar137 = vshufps_avx(auVar99,auVar99,0x55);
  auVar294 = ZEXT1664(auVar137);
  auVar100 = vshufps_avx(auVar99,auVar99,0xaa);
  fVar200 = auVar100._0_4_;
  auVar219._0_4_ = fVar200 * auVar258._0_4_;
  fVar213 = auVar100._4_4_;
  auVar219._4_4_ = fVar213 * auVar258._4_4_;
  fVar214 = auVar100._8_4_;
  auVar219._8_4_ = fVar214 * auVar258._8_4_;
  fVar216 = auVar100._12_4_;
  auVar219._12_4_ = fVar216 * auVar258._12_4_;
  auVar136._0_4_ = auVar8._0_4_ * fVar200;
  auVar136._4_4_ = auVar8._4_4_ * fVar213;
  auVar136._8_4_ = auVar8._8_4_ * fVar214;
  auVar136._12_4_ = auVar8._12_4_ * fVar216;
  auVar100._0_4_ = auVar163._0_4_ * fVar200;
  auVar100._4_4_ = auVar163._4_4_ * fVar213;
  auVar100._8_4_ = auVar163._8_4_ * fVar214;
  auVar100._12_4_ = auVar163._12_4_ * fVar216;
  auVar246 = vfmadd231ps_fma(auVar219,auVar137,auVar246);
  auVar258 = vfmadd231ps_fma(auVar136,auVar137,auVar7);
  auVar7 = vfmadd231ps_fma(auVar100,auVar137,auVar101);
  auVar8 = vfmadd231ps_fma(auVar246,auVar291,auVar109);
  auVar101 = vfmadd231ps_fma(auVar258,auVar291,auVar141);
  auVar163 = vfmadd231ps_fma(auVar7,auVar291,auVar102);
  local_8d0._8_4_ = 0x7fffffff;
  local_8d0._0_8_ = 0x7fffffff7fffffff;
  local_8d0._12_4_ = 0x7fffffff;
  auVar109 = vandps_avx(auVar181,local_8d0);
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  auVar109 = vcmpps_avx(auVar109,auVar201,1);
  auVar246 = vblendvps_avx(auVar181,auVar201,auVar109);
  auVar109 = vandps_avx(auVar138,local_8d0);
  auVar109 = vcmpps_avx(auVar109,auVar201,1);
  auVar258 = vblendvps_avx(auVar138,auVar201,auVar109);
  auVar109 = vandps_avx(auVar202,local_8d0);
  auVar109 = vcmpps_avx(auVar109,auVar201,1);
  auVar109 = vblendvps_avx(auVar202,auVar201,auVar109);
  auVar141 = vrcpps_avx(auVar246);
  auVar230._8_4_ = 0x3f800000;
  auVar230._0_8_ = &DAT_3f8000003f800000;
  auVar230._12_4_ = 0x3f800000;
  auVar246 = vfnmadd213ps_fma(auVar246,auVar141,auVar230);
  auVar141 = vfmadd132ps_fma(auVar246,auVar141,auVar141);
  auVar246 = vrcpps_avx(auVar258);
  auVar258 = vfnmadd213ps_fma(auVar258,auVar246,auVar230);
  auVar7 = vfmadd132ps_fma(auVar258,auVar246,auVar246);
  auVar246 = vrcpps_avx(auVar109);
  auVar109 = vfnmadd213ps_fma(auVar109,auVar246,auVar230);
  auVar102 = vfmadd132ps_fma(auVar109,auVar246,auVar246);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = *(ulong *)(prim + uVar95 * 7 + 6);
  auVar109 = vpmovsxwd_avx(auVar109);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar8);
  auVar202._0_4_ = auVar141._0_4_ * auVar109._0_4_;
  auVar202._4_4_ = auVar141._4_4_ * auVar109._4_4_;
  auVar202._8_4_ = auVar141._8_4_ * auVar109._8_4_;
  auVar202._12_4_ = auVar141._12_4_ * auVar109._12_4_;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *(ulong *)(prim + uVar95 * 9 + 6);
  auVar109 = vpmovsxwd_avx(auVar246);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar8);
  auVar220._0_4_ = auVar141._0_4_ * auVar109._0_4_;
  auVar220._4_4_ = auVar141._4_4_ * auVar109._4_4_;
  auVar220._8_4_ = auVar141._8_4_ * auVar109._8_4_;
  auVar220._12_4_ = auVar141._12_4_ * auVar109._12_4_;
  auVar138._1_3_ = 0;
  auVar138[0] = PVar4;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar246 = vpmovsxwd_avx(auVar258);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar95 * -2 + 6);
  auVar109 = vpmovsxwd_avx(auVar141);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar101);
  auVar237._0_4_ = auVar109._0_4_ * auVar7._0_4_;
  auVar237._4_4_ = auVar109._4_4_ * auVar7._4_4_;
  auVar237._8_4_ = auVar109._8_4_ * auVar7._8_4_;
  auVar237._12_4_ = auVar109._12_4_ * auVar7._12_4_;
  auVar109 = vcvtdq2ps_avx(auVar246);
  auVar109 = vsubps_avx(auVar109,auVar101);
  auVar137._0_4_ = auVar7._0_4_ * auVar109._0_4_;
  auVar137._4_4_ = auVar7._4_4_ * auVar109._4_4_;
  auVar137._8_4_ = auVar7._8_4_ * auVar109._8_4_;
  auVar137._12_4_ = auVar7._12_4_ * auVar109._12_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar91 + uVar95 + 6);
  auVar109 = vpmovsxwd_avx(auVar7);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar163);
  auVar181._0_4_ = auVar102._0_4_ * auVar109._0_4_;
  auVar181._4_4_ = auVar102._4_4_ * auVar109._4_4_;
  auVar181._8_4_ = auVar102._8_4_ * auVar109._8_4_;
  auVar181._12_4_ = auVar102._12_4_ * auVar109._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar95 * 0x17 + 6);
  auVar109 = vpmovsxwd_avx(auVar8);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar109 = vsubps_avx(auVar109,auVar163);
  auVar101._0_4_ = auVar102._0_4_ * auVar109._0_4_;
  auVar101._4_4_ = auVar102._4_4_ * auVar109._4_4_;
  auVar101._8_4_ = auVar102._8_4_ * auVar109._8_4_;
  auVar101._12_4_ = auVar102._12_4_ * auVar109._12_4_;
  auVar109 = vpminsd_avx(auVar202,auVar220);
  auVar246 = vpminsd_avx(auVar237,auVar137);
  auVar109 = vmaxps_avx(auVar109,auVar246);
  auVar246 = vpminsd_avx(auVar181,auVar101);
  uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar245._4_4_ = uVar94;
  auVar245._0_4_ = uVar94;
  auVar245._8_4_ = uVar94;
  auVar245._12_4_ = uVar94;
  auVar246 = vmaxps_avx(auVar246,auVar245);
  auVar109 = vmaxps_avx(auVar109,auVar246);
  local_4b0._0_4_ = auVar109._0_4_ * 0.99999964;
  local_4b0._4_4_ = auVar109._4_4_ * 0.99999964;
  local_4b0._8_4_ = auVar109._8_4_ * 0.99999964;
  local_4b0._12_4_ = auVar109._12_4_ * 0.99999964;
  auVar109 = vpmaxsd_avx(auVar202,auVar220);
  auVar246 = vpmaxsd_avx(auVar237,auVar137);
  auVar109 = vminps_avx(auVar109,auVar246);
  auVar246 = vpmaxsd_avx(auVar181,auVar101);
  fVar200 = (ray->super_RayK<1>).tfar;
  auVar163._4_4_ = fVar200;
  auVar163._0_4_ = fVar200;
  auVar163._8_4_ = fVar200;
  auVar163._12_4_ = fVar200;
  auVar246 = vminps_avx(auVar246,auVar163);
  auVar109 = vminps_avx(auVar109,auVar246);
  auVar102._0_4_ = auVar109._0_4_ * 1.0000004;
  auVar102._4_4_ = auVar109._4_4_ * 1.0000004;
  auVar102._8_4_ = auVar109._8_4_ * 1.0000004;
  auVar102._12_4_ = auVar109._12_4_ * 1.0000004;
  auVar138[4] = PVar4;
  auVar138._5_3_ = 0;
  auVar138[8] = PVar4;
  auVar138._9_3_ = 0;
  auVar138[0xc] = PVar4;
  auVar138._13_3_ = 0;
  auVar246 = vpcmpgtd_avx(auVar138,_DAT_01ff0cf0);
  auVar109 = vcmpps_avx(local_4b0,auVar102,2);
  auVar109 = vandps_avx(auVar109,auVar246);
  uVar92 = vmovmskps_avx(auVar109);
  if (uVar92 == 0) {
    return;
  }
  uVar92 = uVar92 & 0xff;
  auVar124._16_16_ = mm_lookupmask_ps._240_16_;
  auVar124._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar124,ZEXT832(0) << 0x20,0x80);
  local_7a0 = 0x7fffffff;
  uStack_79c = 0x7fffffff;
  uStack_798 = 0x7fffffff;
  uStack_794 = 0x7fffffff;
  uStack_790 = 0x7fffffff;
  uStack_78c = 0x7fffffff;
  uStack_788 = 0x7fffffff;
  uStack_784 = 0x7fffffff;
  local_7d0 = prim;
  local_7d8 = prim + lVar96 + 0x16;
  local_620 = 0x80000000;
  uStack_61c = 0x80000000;
  uStack_618 = 0x80000000;
  uStack_614 = 0x80000000;
  fStack_610 = -0.0;
  fStack_60c = -0.0;
  fStack_608 = -0.0;
  uStack_604 = 0x80000000;
LAB_0165d27f:
  lVar96 = 0;
  local_7c8 = (ulong)uVar92;
  for (uVar95 = local_7c8; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
    lVar96 = lVar96 + 1;
  }
  local_7c8 = local_7c8 - 1 & local_7c8;
  uVar92 = *(uint *)(local_7d0 + lVar96 * 4 + 6);
  uVar95 = (ulong)(uint)((int)lVar96 << 6);
  auVar109 = *(undefined1 (*) [16])(local_7d8 + uVar95);
  if (local_7c8 != 0) {
    uVar93 = local_7c8 - 1 & local_7c8;
    for (uVar91 = local_7c8; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
    }
    if (uVar93 != 0) {
      for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar246 = *(undefined1 (*) [16])(local_7d8 + uVar95 + 0x10);
  auVar258 = *(undefined1 (*) [16])(local_7d8 + uVar95 + 0x20);
  auVar141 = *(undefined1 (*) [16])(local_7d8 + uVar95 + 0x30);
  auVar221._0_4_ = (auVar109._0_4_ + auVar246._0_4_ + auVar258._0_4_ + auVar141._0_4_) * 0.25;
  auVar221._4_4_ = (auVar109._4_4_ + auVar246._4_4_ + auVar258._4_4_ + auVar141._4_4_) * 0.25;
  auVar221._8_4_ = (auVar109._8_4_ + auVar246._8_4_ + auVar258._8_4_ + auVar141._8_4_) * 0.25;
  auVar221._12_4_ = (auVar109._12_4_ + auVar246._12_4_ + auVar258._12_4_ + auVar141._12_4_) * 0.25;
  aVar2 = (ray->super_RayK<1>).org.field_0;
  aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar7 = vsubps_avx(auVar221,(undefined1  [16])aVar2);
  auVar7 = vdpps_avx(auVar7,(undefined1  [16])aVar3,0x7f);
  auVar8 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  local_b08 = (ulong)*(uint *)(local_7d0 + 2);
  auVar102 = vrcpss_avx(auVar8,auVar8);
  auVar8 = vfnmadd213ss_fma(auVar102,auVar8,ZEXT416(0x40000000));
  auVar249 = ZEXT1664(auVar8);
  fVar200 = auVar102._0_4_ * auVar8._0_4_;
  auVar234 = ZEXT464((uint)fVar200);
  fVar200 = auVar7._0_4_ * fVar200;
  local_7f0 = ZEXT416((uint)fVar200);
  auVar222._4_4_ = fVar200;
  auVar222._0_4_ = fVar200;
  auVar222._8_4_ = fVar200;
  auVar222._12_4_ = fVar200;
  fStack_730 = fVar200;
  _local_740 = auVar222;
  fStack_72c = fVar200;
  fStack_728 = fVar200;
  fStack_724 = fVar200;
  auVar7 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar222);
  auVar7 = vblendps_avx(auVar7,_DAT_01feba10,8);
  local_a10 = vsubps_avx(auVar109,auVar7);
  local_a20 = vsubps_avx(auVar258,auVar7);
  local_a30 = vsubps_avx(auVar246,auVar7);
  _local_a40 = vsubps_avx(auVar141,auVar7);
  auVar212 = ZEXT1664(_local_a40);
  auVar109 = vmovshdup_avx(local_a10);
  local_1a0 = auVar109._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar109 = vshufps_avx(local_a10,local_a10,0xaa);
  local_1c0 = auVar109._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar109 = vshufps_avx(local_a10,local_a10,0xff);
  local_2a0 = auVar109._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar109 = vmovshdup_avx(local_a30);
  local_2c0 = auVar109._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar109 = vshufps_avx(local_a30,local_a30,0xaa);
  local_2e0 = auVar109._0_8_;
  uStack_2d8 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2c8 = local_2e0;
  auVar109 = vshufps_avx(local_a30,local_a30,0xff);
  local_1e0 = auVar109._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar109 = vmovshdup_avx(local_a20);
  local_200 = auVar109._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar109 = vshufps_avx(local_a20,local_a20,0xaa);
  local_220 = auVar109._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar109 = vshufps_avx(local_a20,local_a20,0xff);
  local_300 = auVar109._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar109 = vmovshdup_avx(_local_a40);
  local_320 = auVar109._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar109 = vshufps_avx(_local_a40,_local_a40,0xaa);
  local_340 = auVar109._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar109 = vshufps_avx(_local_a40,_local_a40,0xff);
  local_360 = auVar109._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar103._0_4_ = aVar3.x * aVar3.x;
  auVar103._4_4_ = aVar3.y * aVar3.y;
  auVar103._8_4_ = aVar3.z * aVar3.z;
  auVar103._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar109 = vshufps_avx(auVar103,auVar103,0xaa);
  auVar114._0_8_ = auVar109._0_8_;
  auVar114._8_8_ = auVar114._0_8_;
  auVar114._16_8_ = auVar114._0_8_;
  auVar114._24_8_ = auVar114._0_8_;
  uVar94 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_520._4_4_ = uVar94;
  local_520._0_4_ = uVar94;
  fStack_518 = (float)uVar94;
  fStack_514 = (float)uVar94;
  fStack_510 = (float)uVar94;
  fStack_50c = (float)uVar94;
  fStack_508 = (float)uVar94;
  register0x0000125c = uVar94;
  uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_540._4_4_ = uVar94;
  local_540._0_4_ = uVar94;
  fStack_538 = (float)uVar94;
  fStack_534 = (float)uVar94;
  fStack_530 = (float)uVar94;
  fStack_52c = (float)uVar94;
  fStack_528 = (float)uVar94;
  register0x0000135c = uVar94;
  auVar228 = ZEXT3264(_local_540);
  auVar109 = vfmadd231ps_fma(auVar114,_local_540,_local_540);
  auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),_local_520,_local_520);
  uVar95 = 1;
  uVar91 = 0;
  local_560 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_55c = local_560;
  fStack_558 = local_560;
  fStack_554 = local_560;
  fStack_550 = local_560;
  fStack_54c = local_560;
  fStack_548 = local_560;
  fStack_544 = local_560;
  local_380 = local_a10._0_4_;
  uStack_37c = local_380;
  uStack_378 = local_380;
  uStack_374 = local_380;
  uStack_370 = local_380;
  uStack_36c = local_380;
  uStack_368 = local_380;
  uStack_364 = local_380;
  local_3a0 = local_a30._0_4_;
  uStack_39c = local_3a0;
  uStack_398 = local_3a0;
  uStack_394 = local_3a0;
  uStack_390 = local_3a0;
  uStack_38c = local_3a0;
  uStack_388 = local_3a0;
  uStack_384 = local_3a0;
  local_3c0 = local_a20._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  local_3e0 = local_a40._0_4_;
  fStack_3dc = local_3e0;
  fStack_3d8 = local_3e0;
  fStack_3d4 = local_3e0;
  fStack_3d0 = local_3e0;
  fStack_3cc = local_3e0;
  fStack_3c8 = local_3e0;
  fStack_3c4 = local_3e0;
  local_240 = ZEXT1632(auVar109);
  auVar160._4_4_ = uStack_79c;
  auVar160._0_4_ = local_7a0;
  auVar160._8_4_ = uStack_798;
  auVar160._12_4_ = uStack_794;
  auVar160._16_4_ = uStack_790;
  auVar160._20_4_ = uStack_78c;
  auVar160._24_4_ = uStack_788;
  auVar160._28_4_ = uStack_784;
  local_420 = vandps_avx(ZEXT1632(auVar109),auVar160);
  local_800 = 0x3f80000000000000;
  uStack_7f8 = 0;
  do {
    auVar63._8_8_ = uStack_7f8;
    auVar63._0_8_ = local_800;
    auVar109 = vmovshdup_avx(auVar63);
    fVar213 = (float)local_800;
    fVar200 = auVar109._0_4_ - fVar213;
    fVar279 = fVar200 * 0.04761905;
    local_960._4_4_ = fVar213;
    local_960._0_4_ = fVar213;
    local_960._8_4_ = fVar213;
    local_960._12_4_ = fVar213;
    local_960._16_4_ = fVar213;
    local_960._20_4_ = fVar213;
    local_960._24_4_ = fVar213;
    local_960._28_4_ = fVar213;
    local_840._4_4_ = fVar200;
    local_840._0_4_ = fVar200;
    local_840._8_4_ = fVar200;
    local_840._12_4_ = fVar200;
    local_840._16_4_ = fVar200;
    local_840._20_4_ = fVar200;
    local_840._24_4_ = fVar200;
    local_840._28_4_ = fVar200;
    auVar109 = vfmadd231ps_fma(local_960,local_840,_DAT_02020f20);
    auVar115._8_4_ = 0x3f800000;
    auVar115._0_8_ = &DAT_3f8000003f800000;
    auVar115._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar115,ZEXT1632(auVar109));
    fVar200 = auVar124._0_4_;
    fVar214 = auVar124._4_4_;
    fVar215 = auVar124._8_4_;
    fVar217 = auVar124._12_4_;
    fVar276 = auVar124._16_4_;
    fVar277 = auVar124._20_4_;
    fVar278 = auVar124._24_4_;
    fVar98 = fVar200 * fVar200 * fVar200;
    fVar130 = fVar214 * fVar214 * fVar214;
    fVar131 = fVar215 * fVar215 * fVar215;
    fVar132 = fVar217 * fVar217 * fVar217;
    fVar133 = fVar276 * fVar276 * fVar276;
    fVar134 = fVar277 * fVar277 * fVar277;
    fVar135 = fVar278 * fVar278 * fVar278;
    fVar213 = auVar109._0_4_;
    fVar216 = auVar109._4_4_;
    fVar235 = auVar109._8_4_;
    fVar267 = auVar109._12_4_;
    fVar162 = fVar213 * fVar213 * fVar213;
    fVar178 = fVar216 * fVar216 * fVar216;
    fVar179 = fVar235 * fVar235 * fVar235;
    fVar180 = fVar267 * fVar267 * fVar267;
    fVar244 = fVar200 * fVar213;
    fVar250 = fVar214 * fVar216;
    fVar251 = fVar215 * fVar235;
    fVar252 = fVar217 * fVar267;
    fVar253 = fVar276 * 0.0;
    fVar254 = fVar277 * 0.0;
    fVar255 = fVar278 * 0.0;
    fVar262 = auVar261._28_4_ + auVar275._28_4_ + 1.0;
    fVar280 = auVar266._28_4_;
    auVar9._4_4_ = fVar130 * 0.16666667;
    auVar9._0_4_ = fVar98 * 0.16666667;
    auVar9._8_4_ = fVar131 * 0.16666667;
    auVar9._12_4_ = fVar132 * 0.16666667;
    auVar9._16_4_ = fVar133 * 0.16666667;
    auVar9._20_4_ = fVar134 * 0.16666667;
    auVar9._24_4_ = fVar135 * 0.16666667;
    auVar9._28_4_ = fVar262;
    auVar11._4_4_ =
         (fVar214 * fVar250 * 12.0 + fVar250 * fVar216 * 6.0 + fVar178 + fVar130 * 4.0) * 0.16666667
    ;
    auVar11._0_4_ =
         (fVar200 * fVar244 * 12.0 + fVar244 * fVar213 * 6.0 + fVar162 + fVar98 * 4.0) * 0.16666667;
    auVar11._8_4_ =
         (fVar215 * fVar251 * 12.0 + fVar251 * fVar235 * 6.0 + fVar179 + fVar131 * 4.0) * 0.16666667
    ;
    auVar11._12_4_ =
         (fVar217 * fVar252 * 12.0 + fVar252 * fVar267 * 6.0 + fVar180 + fVar132 * 4.0) * 0.16666667
    ;
    auVar11._16_4_ =
         (fVar276 * fVar253 * 12.0 + fVar253 * 0.0 * 6.0 + fVar133 * 4.0 + 0.0) * 0.16666667;
    auVar11._20_4_ =
         (fVar277 * fVar254 * 12.0 + fVar254 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar11._24_4_ =
         (fVar278 * fVar255 * 12.0 + fVar255 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar11._28_4_ = fVar280;
    auVar149._4_4_ =
         (fVar178 * 4.0 + fVar130 + fVar250 * fVar216 * 12.0 + fVar214 * fVar250 * 6.0) * 0.16666667
    ;
    auVar149._0_4_ =
         (fVar162 * 4.0 + fVar98 + fVar244 * fVar213 * 12.0 + fVar200 * fVar244 * 6.0) * 0.16666667;
    auVar149._8_4_ =
         (fVar179 * 4.0 + fVar131 + fVar251 * fVar235 * 12.0 + fVar215 * fVar251 * 6.0) * 0.16666667
    ;
    auVar149._12_4_ =
         (fVar180 * 4.0 + fVar132 + fVar252 * fVar267 * 12.0 + fVar217 * fVar252 * 6.0) * 0.16666667
    ;
    auVar149._16_4_ = (fVar133 + 0.0 + fVar253 * 0.0 * 12.0 + fVar276 * fVar253 * 6.0) * 0.16666667;
    auVar149._20_4_ = (fVar134 + 0.0 + fVar254 * 0.0 * 12.0 + fVar277 * fVar254 * 6.0) * 0.16666667;
    auVar149._24_4_ = (fVar135 + 0.0 + fVar255 * 0.0 * 12.0 + fVar278 * fVar255 * 6.0) * 0.16666667;
    auVar149._28_4_ = auVar275._28_4_;
    fVar162 = fVar162 * 0.16666667;
    fVar178 = fVar178 * 0.16666667;
    fVar179 = fVar179 * 0.16666667;
    fVar180 = fVar180 * 0.16666667;
    auVar232._4_4_ = fVar178 * fStack_3dc;
    auVar232._0_4_ = fVar162 * local_3e0;
    auVar232._8_4_ = fVar179 * fStack_3d8;
    auVar232._12_4_ = fVar180 * fStack_3d4;
    auVar232._16_4_ = fStack_3d0 * 0.0;
    auVar232._20_4_ = fStack_3cc * 0.0;
    auVar232._24_4_ = fStack_3c8 * 0.0;
    auVar232._28_4_ = 0x3f800000;
    auVar261._0_4_ = fVar162 * (float)local_320;
    auVar261._4_4_ = fVar178 * local_320._4_4_;
    auVar261._8_4_ = fVar179 * (float)uStack_318;
    auVar261._12_4_ = fVar180 * uStack_318._4_4_;
    auVar261._16_4_ = (float)uStack_310 * 0.0;
    auVar261._20_4_ = uStack_310._4_4_ * 0.0;
    auVar261._28_36_ = auVar294._28_36_;
    auVar261._24_4_ = (float)uStack_308 * 0.0;
    auVar14._4_4_ = fVar178 * local_340._4_4_;
    auVar14._0_4_ = fVar162 * (float)local_340;
    auVar14._8_4_ = fVar179 * (float)uStack_338;
    auVar14._12_4_ = fVar180 * uStack_338._4_4_;
    auVar14._16_4_ = (float)uStack_330 * 0.0;
    auVar14._20_4_ = uStack_330._4_4_ * 0.0;
    auVar14._24_4_ = (float)uStack_328 * 0.0;
    auVar14._28_4_ = 0x40c00000;
    auVar123._4_4_ = fVar178 * local_360._4_4_;
    auVar123._0_4_ = fVar162 * (float)local_360;
    auVar123._8_4_ = fVar179 * (float)uStack_358;
    auVar123._12_4_ = fVar180 * uStack_358._4_4_;
    auVar123._16_4_ = (float)uStack_350 * 0.0;
    auVar123._20_4_ = uStack_350._4_4_ * 0.0;
    auVar123._24_4_ = (float)uStack_348 * 0.0;
    auVar123._28_4_ = fVar262 + fVar280 + auVar228._28_4_;
    auVar70._4_4_ = uStack_3bc;
    auVar70._0_4_ = local_3c0;
    auVar70._8_4_ = uStack_3b8;
    auVar70._12_4_ = uStack_3b4;
    auVar70._16_4_ = uStack_3b0;
    auVar70._20_4_ = uStack_3ac;
    auVar70._24_4_ = uStack_3a8;
    auVar70._28_4_ = uStack_3a4;
    auVar109 = vfmadd231ps_fma(auVar232,auVar149,auVar70);
    auVar85._8_8_ = uStack_1f8;
    auVar85._0_8_ = local_200;
    auVar85._16_8_ = uStack_1f0;
    auVar85._24_8_ = uStack_1e8;
    auVar246 = vfmadd231ps_fma(auVar261._0_32_,auVar149,auVar85);
    auVar84._8_8_ = uStack_218;
    auVar84._0_8_ = local_220;
    auVar84._16_8_ = uStack_210;
    auVar84._24_8_ = uStack_208;
    auVar258 = vfmadd231ps_fma(auVar14,auVar149,auVar84);
    auVar76._8_8_ = uStack_2f8;
    auVar76._0_8_ = local_300;
    auVar76._16_8_ = uStack_2f0;
    auVar76._24_8_ = uStack_2e8;
    auVar141 = vfmadd231ps_fma(auVar123,auVar149,auVar76);
    auVar72._4_4_ = uStack_39c;
    auVar72._0_4_ = local_3a0;
    auVar72._8_4_ = uStack_398;
    auVar72._12_4_ = uStack_394;
    auVar72._16_4_ = uStack_390;
    auVar72._20_4_ = uStack_38c;
    auVar72._24_4_ = uStack_388;
    auVar72._28_4_ = uStack_384;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar11,auVar72);
    auVar80._8_8_ = uStack_2b8;
    auVar80._0_8_ = local_2c0;
    auVar80._16_8_ = uStack_2b0;
    auVar80._24_8_ = uStack_2a8;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar11,auVar80);
    auVar78._8_8_ = uStack_2d8;
    auVar78._0_8_ = local_2e0;
    auVar78._16_8_ = uStack_2d0;
    auVar78._24_8_ = uStack_2c8;
    auVar258 = vfmadd231ps_fma(ZEXT1632(auVar258),auVar11,auVar78);
    auVar86._8_8_ = uStack_1d8;
    auVar86._0_8_ = local_1e0;
    auVar86._16_8_ = uStack_1d0;
    auVar86._24_8_ = uStack_1c8;
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar86,auVar11);
    auVar74._4_4_ = uStack_37c;
    auVar74._0_4_ = local_380;
    auVar74._8_4_ = uStack_378;
    auVar74._12_4_ = uStack_374;
    auVar74._16_4_ = uStack_370;
    auVar74._20_4_ = uStack_36c;
    auVar74._24_4_ = uStack_368;
    auVar74._28_4_ = uStack_364;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar9,auVar74);
    local_ae0 = ZEXT1632(auVar109);
    auVar88._8_8_ = uStack_198;
    auVar88._0_8_ = local_1a0;
    auVar88._16_8_ = uStack_190;
    auVar88._24_8_ = uStack_188;
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar9,auVar88);
    auVar87._8_8_ = uStack_1b8;
    auVar87._0_8_ = local_1c0;
    auVar87._16_8_ = uStack_1b0;
    auVar87._24_8_ = uStack_1a8;
    auVar258 = vfmadd231ps_fma(ZEXT1632(auVar258),auVar9,auVar87);
    auVar82._8_8_ = uStack_298;
    auVar82._0_8_ = local_2a0;
    auVar82._16_8_ = uStack_290;
    auVar82._24_8_ = uStack_288;
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar9,auVar82);
    auVar229._0_4_ = (float)((uint)fVar213 ^ local_620) * fVar213;
    auVar229._4_4_ = (float)((uint)fVar216 ^ uStack_61c) * fVar216;
    auVar229._8_4_ = (float)((uint)fVar235 ^ uStack_618) * fVar235;
    auVar229._12_4_ = (float)((uint)fVar267 ^ uStack_614) * fVar267;
    auVar229._16_4_ = fStack_610 * 0.0;
    auVar229._20_4_ = fStack_60c * 0.0;
    auVar229._24_4_ = fStack_608 * 0.0;
    auVar229._28_4_ = 0;
    auVar269._4_4_ = fVar250 * 4.0;
    auVar269._0_4_ = fVar244 * 4.0;
    auVar269._8_4_ = fVar251 * 4.0;
    auVar269._12_4_ = fVar252 * 4.0;
    auVar269._16_4_ = fVar253 * 4.0;
    auVar269._20_4_ = fVar254 * 4.0;
    fVar98 = auVar249._28_4_;
    auVar269._24_4_ = fVar255 * 4.0;
    auVar269._28_4_ = fVar98;
    auVar160 = vsubps_avx(auVar229,auVar269);
    fVar130 = fVar98 + auVar234._28_4_;
    auVar10._4_4_ = fVar214 * (float)((uint)fVar214 ^ uStack_61c) * 0.5;
    auVar10._0_4_ = fVar200 * (float)((uint)fVar200 ^ local_620) * 0.5;
    auVar10._8_4_ = fVar215 * (float)((uint)fVar215 ^ uStack_618) * 0.5;
    auVar10._12_4_ = fVar217 * (float)((uint)fVar217 ^ uStack_614) * 0.5;
    auVar10._16_4_ = fVar276 * (float)((uint)fVar276 ^ (uint)fStack_610) * 0.5;
    auVar10._20_4_ = fVar277 * (float)((uint)fVar277 ^ (uint)fStack_60c) * 0.5;
    auVar10._24_4_ = fVar278 * (float)((uint)fVar278 ^ (uint)fStack_608) * 0.5;
    auVar10._28_4_ = auVar124._28_4_;
    auVar12._4_4_ = auVar160._4_4_ * 0.5;
    auVar12._0_4_ = auVar160._0_4_ * 0.5;
    auVar12._8_4_ = auVar160._8_4_ * 0.5;
    auVar12._12_4_ = auVar160._12_4_ * 0.5;
    auVar12._16_4_ = auVar160._16_4_ * 0.5;
    auVar12._20_4_ = auVar160._20_4_ * 0.5;
    auVar12._24_4_ = auVar160._24_4_ * 0.5;
    auVar12._28_4_ = auVar160._28_4_;
    auVar15._4_4_ = (fVar250 * 4.0 + fVar214 * fVar214) * 0.5;
    auVar15._0_4_ = (fVar244 * 4.0 + fVar200 * fVar200) * 0.5;
    auVar15._8_4_ = (fVar251 * 4.0 + fVar215 * fVar215) * 0.5;
    auVar15._12_4_ = (fVar252 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar15._16_4_ = (fVar253 * 4.0 + fVar276 * fVar276) * 0.5;
    auVar15._20_4_ = (fVar254 * 4.0 + fVar277 * fVar277) * 0.5;
    auVar15._24_4_ = (fVar255 * 4.0 + fVar278 * fVar278) * 0.5;
    auVar15._28_4_ = fVar130;
    fVar200 = fVar213 * fVar213 * 0.5;
    fVar213 = fVar216 * fVar216 * 0.5;
    fVar214 = fVar235 * fVar235 * 0.5;
    fVar216 = fVar267 * fVar267 * 0.5;
    auVar16._4_4_ = fVar213 * fStack_3dc;
    auVar16._0_4_ = fVar200 * local_3e0;
    auVar16._8_4_ = fVar214 * fStack_3d8;
    auVar16._12_4_ = fVar216 * fStack_3d4;
    auVar16._16_4_ = fStack_3d0 * 0.0;
    auVar16._20_4_ = fStack_3cc * 0.0;
    auVar16._24_4_ = fStack_3c8 * 0.0;
    auVar16._28_4_ = fVar98;
    auVar17._4_4_ = fVar213 * local_320._4_4_;
    auVar17._0_4_ = fVar200 * (float)local_320;
    auVar17._8_4_ = fVar214 * (float)uStack_318;
    auVar17._12_4_ = fVar216 * uStack_318._4_4_;
    auVar17._16_4_ = (float)uStack_310 * 0.0;
    auVar17._20_4_ = uStack_310._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_308 * 0.0;
    auVar17._28_4_ = uStack_604;
    auVar18._4_4_ = fVar213 * local_340._4_4_;
    auVar18._0_4_ = fVar200 * (float)local_340;
    auVar18._8_4_ = fVar214 * (float)uStack_338;
    auVar18._12_4_ = fVar216 * uStack_338._4_4_;
    auVar18._16_4_ = (float)uStack_330 * 0.0;
    auVar18._20_4_ = uStack_330._4_4_ * 0.0;
    auVar18._24_4_ = (float)uStack_328 * 0.0;
    auVar18._28_4_ = fVar280;
    auVar19._4_4_ = fVar213 * local_360._4_4_;
    auVar19._0_4_ = fVar200 * (float)local_360;
    auVar19._8_4_ = fVar214 * (float)uStack_358;
    auVar19._12_4_ = fVar216 * uStack_358._4_4_;
    auVar19._16_4_ = (float)uStack_350 * 0.0;
    auVar19._20_4_ = uStack_350._4_4_ * 0.0;
    auVar19._24_4_ = (float)uStack_348 * 0.0;
    auVar19._28_4_ = auVar212._28_4_;
    auVar71._4_4_ = uStack_3bc;
    auVar71._0_4_ = local_3c0;
    auVar71._8_4_ = uStack_3b8;
    auVar71._12_4_ = uStack_3b4;
    auVar71._16_4_ = uStack_3b0;
    auVar71._20_4_ = uStack_3ac;
    auVar71._24_4_ = uStack_3a8;
    auVar71._28_4_ = uStack_3a4;
    auVar109 = vfmadd231ps_fma(auVar16,auVar15,auVar71);
    auVar7 = vfmadd231ps_fma(auVar17,auVar15,auVar85);
    auVar8 = vfmadd231ps_fma(auVar18,auVar15,auVar84);
    auVar77._8_8_ = uStack_2f8;
    auVar77._0_8_ = local_300;
    auVar77._16_8_ = uStack_2f0;
    auVar77._24_8_ = uStack_2e8;
    auVar102 = vfmadd231ps_fma(auVar19,auVar15,auVar77);
    auVar73._4_4_ = uStack_39c;
    auVar73._0_4_ = local_3a0;
    auVar73._8_4_ = uStack_398;
    auVar73._12_4_ = uStack_394;
    auVar73._16_4_ = uStack_390;
    auVar73._20_4_ = uStack_38c;
    auVar73._24_4_ = uStack_388;
    auVar73._28_4_ = uStack_384;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar12,auVar73);
    auVar81._8_8_ = uStack_2b8;
    auVar81._0_8_ = local_2c0;
    auVar81._16_8_ = uStack_2b0;
    auVar81._24_8_ = uStack_2a8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar12,auVar81);
    auVar79._8_8_ = uStack_2d8;
    auVar79._0_8_ = local_2e0;
    auVar79._16_8_ = uStack_2d0;
    auVar79._24_8_ = uStack_2c8;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar12,auVar79);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar86,auVar12);
    auVar75._4_4_ = uStack_37c;
    auVar75._0_4_ = local_380;
    auVar75._8_4_ = uStack_378;
    auVar75._12_4_ = uStack_374;
    auVar75._16_4_ = uStack_370;
    auVar75._20_4_ = uStack_36c;
    auVar75._24_4_ = uStack_368;
    auVar75._28_4_ = uStack_364;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar10,auVar75);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar10,auVar88);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar10,auVar87);
    auVar83._8_8_ = uStack_298;
    auVar83._0_8_ = local_2a0;
    auVar83._16_8_ = uStack_290;
    auVar83._24_8_ = uStack_288;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar10,auVar83);
    local_a60._0_4_ = auVar109._0_4_ * fVar279;
    local_a60._4_4_ = auVar109._4_4_ * fVar279;
    local_a60._8_4_ = auVar109._8_4_ * fVar279;
    local_a60._12_4_ = auVar109._12_4_ * fVar279;
    local_a60._16_4_ = fVar279 * 0.0;
    local_a60._20_4_ = fVar279 * 0.0;
    local_a60._24_4_ = fVar279 * 0.0;
    local_a60._28_4_ = 0;
    local_6c0._0_4_ = auVar7._0_4_ * fVar279;
    local_6c0._4_4_ = auVar7._4_4_ * fVar279;
    local_6c0._8_4_ = auVar7._8_4_ * fVar279;
    local_6c0._12_4_ = auVar7._12_4_ * fVar279;
    local_6c0._16_4_ = fVar279 * 0.0;
    local_6c0._20_4_ = fVar279 * 0.0;
    local_6c0._24_4_ = fVar279 * 0.0;
    local_6c0._28_4_ = 0;
    local_9e0._0_4_ = auVar8._0_4_ * fVar279;
    local_9e0._4_4_ = auVar8._4_4_ * fVar279;
    local_9e0._8_4_ = auVar8._8_4_ * fVar279;
    local_9e0._12_4_ = auVar8._12_4_ * fVar279;
    local_9e0._16_4_ = fVar279 * 0.0;
    local_9e0._20_4_ = fVar279 * 0.0;
    local_9e0._24_4_ = fVar279 * 0.0;
    local_9e0._28_4_ = 0;
    auVar209._0_4_ = fVar279 * auVar102._0_4_;
    auVar209._4_4_ = fVar279 * auVar102._4_4_;
    auVar209._8_4_ = fVar279 * auVar102._8_4_;
    auVar209._12_4_ = fVar279 * auVar102._12_4_;
    auVar209._16_4_ = fVar279 * 0.0;
    auVar209._20_4_ = fVar279 * 0.0;
    auVar209._24_4_ = fVar279 * 0.0;
    auVar209._28_4_ = 0;
    _local_980 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    local_900 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar246));
    local_820 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar258));
    local_680 = vsubps_avx(_local_980,local_ae0);
    local_660 = vsubps_avx(local_820,ZEXT1632(auVar258));
    fVar200 = local_660._0_4_;
    fVar214 = local_660._4_4_;
    auVar20._4_4_ = local_a60._4_4_ * fVar214;
    auVar20._0_4_ = local_a60._0_4_ * fVar200;
    fVar215 = local_660._8_4_;
    auVar20._8_4_ = local_a60._8_4_ * fVar215;
    fVar217 = local_660._12_4_;
    auVar20._12_4_ = local_a60._12_4_ * fVar217;
    fVar276 = local_660._16_4_;
    auVar20._16_4_ = local_a60._16_4_ * fVar276;
    fVar278 = local_660._20_4_;
    auVar20._20_4_ = local_a60._20_4_ * fVar278;
    fVar280 = local_660._24_4_;
    auVar20._24_4_ = local_a60._24_4_ * fVar280;
    auVar20._28_4_ = local_820._28_4_;
    auVar109 = vfmsub231ps_fma(auVar20,local_9e0,local_680);
    _local_6a0 = vsubps_avx(local_900,ZEXT1632(auVar246));
    fVar254 = local_680._0_4_;
    fVar255 = local_680._4_4_;
    auVar21._4_4_ = fVar255 * local_6c0._4_4_;
    auVar21._0_4_ = fVar254 * local_6c0._0_4_;
    fVar262 = local_680._8_4_;
    auVar21._8_4_ = fVar262 * local_6c0._8_4_;
    fVar285 = local_680._12_4_;
    auVar21._12_4_ = fVar285 * local_6c0._12_4_;
    fVar287 = local_680._16_4_;
    auVar21._16_4_ = fVar287 * local_6c0._16_4_;
    fVar288 = local_680._20_4_;
    auVar21._20_4_ = fVar288 * local_6c0._20_4_;
    fVar289 = local_680._24_4_;
    auVar21._24_4_ = fVar289 * local_6c0._24_4_;
    auVar21._28_4_ = local_900._28_4_;
    auVar7 = vfmsub231ps_fma(auVar21,local_a60,_local_6a0);
    auVar109 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar7._12_4_ * auVar7._12_4_,
                                                  CONCAT48(auVar7._8_4_ * auVar7._8_4_,
                                                           CONCAT44(auVar7._4_4_ * auVar7._4_4_,
                                                                    auVar7._0_4_ * auVar7._0_4_)))),
                               ZEXT1632(auVar109),ZEXT1632(auVar109));
    fVar213 = local_6a0._0_4_;
    fVar216 = local_6a0._4_4_;
    auVar22._4_4_ = local_9e0._4_4_ * fVar216;
    auVar22._0_4_ = (float)local_9e0._0_4_ * fVar213;
    fVar235 = local_6a0._8_4_;
    auVar22._8_4_ = local_9e0._8_4_ * fVar235;
    fVar267 = local_6a0._12_4_;
    auVar22._12_4_ = local_9e0._12_4_ * fVar267;
    fVar277 = local_6a0._16_4_;
    auVar22._16_4_ = local_9e0._16_4_ * fVar277;
    fVar279 = local_6a0._20_4_;
    auVar22._20_4_ = local_9e0._20_4_ * fVar279;
    fVar98 = local_6a0._24_4_;
    auVar22._24_4_ = local_9e0._24_4_ * fVar98;
    auVar22._28_4_ = fVar130;
    auVar8 = vfmsub231ps_fma(auVar22,local_6c0,local_660);
    auVar195._0_4_ = fVar200 * fVar200;
    auVar195._4_4_ = fVar214 * fVar214;
    auVar195._8_4_ = fVar215 * fVar215;
    auVar195._12_4_ = fVar217 * fVar217;
    auVar195._16_4_ = fVar276 * fVar276;
    auVar195._20_4_ = fVar278 * fVar278;
    auVar195._24_4_ = fVar280 * fVar280;
    auVar195._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar195,_local_6a0,_local_6a0);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_680,local_680);
    auVar124 = vrcpps_avx(ZEXT1632(auVar7));
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar109),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar268._8_4_ = 0x3f800000;
    auVar268._0_8_ = &DAT_3f8000003f800000;
    auVar268._12_4_ = 0x3f800000;
    auVar268._16_4_ = 0x3f800000;
    auVar268._20_4_ = 0x3f800000;
    auVar268._24_4_ = 0x3f800000;
    auVar268._28_4_ = 0x3f800000;
    auVar109 = vfnmadd213ps_fma(auVar124,ZEXT1632(auVar7),auVar268);
    auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar124,auVar124);
    local_920 = vpermps_avx2(_DAT_0205d4a0,local_a60);
    local_a00 = vpermps_avx2(_DAT_0205d4a0,local_9e0);
    auVar23._4_4_ = local_920._4_4_ * fVar214;
    auVar23._0_4_ = local_920._0_4_ * fVar200;
    auVar23._8_4_ = local_920._8_4_ * fVar215;
    auVar23._12_4_ = local_920._12_4_ * fVar217;
    auVar23._16_4_ = local_920._16_4_ * fVar276;
    auVar23._20_4_ = local_920._20_4_ * fVar278;
    auVar23._24_4_ = local_920._24_4_ * fVar280;
    auVar23._28_4_ = auVar124._28_4_;
    auVar102 = vfmsub231ps_fma(auVar23,local_a00,local_680);
    local_940 = vpermps_avx2(_DAT_0205d4a0,local_6c0);
    auVar24._4_4_ = fVar255 * local_940._4_4_;
    auVar24._0_4_ = fVar254 * local_940._0_4_;
    auVar24._8_4_ = fVar262 * local_940._8_4_;
    auVar24._12_4_ = fVar285 * local_940._12_4_;
    auVar24._16_4_ = fVar287 * local_940._16_4_;
    auVar24._20_4_ = fVar288 * local_940._20_4_;
    auVar24._24_4_ = fVar289 * local_940._24_4_;
    auVar24._28_4_ = 0;
    auVar101 = vfmsub231ps_fma(auVar24,local_920,_local_6a0);
    auVar102 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar101._12_4_ * auVar101._12_4_,
                                                  CONCAT48(auVar101._8_4_ * auVar101._8_4_,
                                                           CONCAT44(auVar101._4_4_ * auVar101._4_4_,
                                                                    auVar101._0_4_ * auVar101._0_4_)
                                                          ))),ZEXT1632(auVar102),ZEXT1632(auVar102))
    ;
    fVar179 = local_a00._0_4_;
    auVar238._0_4_ = fVar179 * fVar213;
    fVar180 = local_a00._4_4_;
    auVar238._4_4_ = fVar180 * fVar216;
    fVar244 = local_a00._8_4_;
    auVar238._8_4_ = fVar244 * fVar235;
    fVar250 = local_a00._12_4_;
    auVar238._12_4_ = fVar250 * fVar267;
    fVar251 = local_a00._16_4_;
    auVar238._16_4_ = fVar251 * fVar277;
    fVar252 = local_a00._20_4_;
    auVar238._20_4_ = fVar252 * fVar279;
    fVar253 = local_a00._24_4_;
    auVar238._24_4_ = fVar253 * fVar98;
    auVar238._28_4_ = 0;
    auVar101 = vfmsub231ps_fma(auVar238,local_940,local_660);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT1632(auVar101),ZEXT1632(auVar101));
    auVar124 = vmaxps_avx(ZEXT1632(CONCAT412(auVar8._12_4_ * auVar109._12_4_,
                                             CONCAT48(auVar8._8_4_ * auVar109._8_4_,
                                                      CONCAT44(auVar8._4_4_ * auVar109._4_4_,
                                                               auVar8._0_4_ * auVar109._0_4_)))),
                          ZEXT1632(CONCAT412(auVar102._12_4_ * auVar109._12_4_,
                                             CONCAT48(auVar102._8_4_ * auVar109._8_4_,
                                                      CONCAT44(auVar102._4_4_ * auVar109._4_4_,
                                                               auVar102._0_4_ * auVar109._0_4_)))));
    local_880._0_4_ = auVar209._0_4_ + auVar141._0_4_;
    local_880._4_4_ = auVar209._4_4_ + auVar141._4_4_;
    local_880._8_4_ = auVar209._8_4_ + auVar141._8_4_;
    local_880._12_4_ = auVar209._12_4_ + auVar141._12_4_;
    local_880._16_4_ = auVar209._16_4_ + 0.0;
    local_880._20_4_ = auVar209._20_4_ + 0.0;
    local_880._24_4_ = auVar209._24_4_ + 0.0;
    local_880._28_4_ = 0;
    auVar160 = vsubps_avx(ZEXT1632(auVar141),auVar209);
    _local_8a0 = vpermps_avx2(_DAT_0205d4a0,auVar160);
    local_860 = ZEXT1632(auVar141);
    local_6e0 = vpermps_avx2(_DAT_0205d4a0,local_860);
    auVar160 = vmaxps_avx(local_860,local_880);
    auVar14 = local_6e0;
    auVar114 = vmaxps_avx(_local_8a0,local_6e0);
    auVar9 = vrsqrtps_avx(ZEXT1632(auVar7));
    auVar160 = vmaxps_avx(auVar160,auVar114);
    fVar130 = auVar9._0_4_;
    fVar131 = auVar9._4_4_;
    fVar132 = auVar9._8_4_;
    fVar133 = auVar9._12_4_;
    fVar134 = auVar9._16_4_;
    fVar135 = auVar9._20_4_;
    fVar162 = auVar9._24_4_;
    auVar25._4_4_ = fVar131 * fVar131 * fVar131 * auVar7._4_4_ * -0.5;
    auVar25._0_4_ = fVar130 * fVar130 * fVar130 * auVar7._0_4_ * -0.5;
    auVar25._8_4_ = fVar132 * fVar132 * fVar132 * auVar7._8_4_ * -0.5;
    auVar25._12_4_ = fVar133 * fVar133 * fVar133 * auVar7._12_4_ * -0.5;
    auVar25._16_4_ = fVar134 * fVar134 * fVar134 * -0.0;
    auVar25._20_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar25._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
    auVar25._28_4_ = local_940._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar109 = vfmadd231ps_fma(auVar25,auVar116,auVar9);
    auVar261 = ZEXT1664(auVar109);
    local_ac0 = ZEXT1632(auVar109);
    fVar134 = auVar109._0_4_;
    fVar135 = auVar109._4_4_;
    auVar26._4_4_ = fVar135 * fVar216;
    auVar26._0_4_ = fVar134 * fVar213;
    fVar162 = auVar109._8_4_;
    auVar26._8_4_ = fVar162 * fVar235;
    fVar178 = auVar109._12_4_;
    auVar26._12_4_ = fVar178 * fVar267;
    auVar26._16_4_ = fVar277 * 0.0;
    auVar26._20_4_ = fVar279 * 0.0;
    auVar26._24_4_ = fVar98 * 0.0;
    auVar26._28_4_ = 0;
    auVar27._4_4_ = fVar135 * fVar214 * fStack_55c;
    auVar27._0_4_ = fVar134 * fVar200 * local_560;
    auVar27._8_4_ = fVar162 * fVar215 * fStack_558;
    auVar27._12_4_ = fVar178 * fVar217 * fStack_554;
    auVar27._16_4_ = fVar276 * 0.0 * fStack_550;
    auVar27._20_4_ = fVar278 * 0.0 * fStack_54c;
    auVar27._24_4_ = fVar280 * 0.0 * fStack_548;
    auVar27._28_4_ = local_660._28_4_;
    auVar109 = vfmadd231ps_fma(auVar27,auVar26,_local_540);
    auVar275 = ZEXT864(0) << 0x20;
    local_640 = ZEXT1632(auVar258);
    auVar114 = vsubps_avx(ZEXT832(0) << 0x20,local_640);
    fVar213 = auVar114._0_4_;
    fVar216 = auVar114._4_4_;
    auVar28._4_4_ = fVar135 * fVar214 * fVar216;
    auVar28._0_4_ = fVar134 * fVar200 * fVar213;
    fVar235 = auVar114._8_4_;
    auVar28._8_4_ = fVar162 * fVar215 * fVar235;
    fVar267 = auVar114._12_4_;
    auVar28._12_4_ = fVar178 * fVar217 * fVar267;
    fVar277 = auVar114._16_4_;
    auVar28._16_4_ = fVar276 * 0.0 * fVar277;
    fVar276 = auVar114._20_4_;
    auVar28._20_4_ = fVar278 * 0.0 * fVar276;
    fVar278 = auVar114._24_4_;
    auVar28._24_4_ = fVar280 * 0.0 * fVar278;
    auVar28._28_4_ = 0x3fc00000;
    _local_780 = ZEXT1632(auVar246);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,_local_780);
    auVar266 = ZEXT3264(auVar11);
    auVar246 = vfmadd231ps_fma(auVar28,auVar11,auVar26);
    auVar29._4_4_ = fVar255 * fVar135;
    auVar29._0_4_ = fVar254 * fVar134;
    auVar29._8_4_ = fVar262 * fVar162;
    auVar29._12_4_ = fVar285 * fVar178;
    auVar29._16_4_ = fVar287 * 0.0;
    auVar29._20_4_ = fVar288 * 0.0;
    auVar29._24_4_ = fVar289 * 0.0;
    auVar29._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar29,_local_520);
    auVar269 = ZEXT832(0) << 0x20;
    auVar149 = vsubps_avx(auVar269,local_ae0);
    auVar294 = ZEXT3264(auVar149);
    auVar246 = vfmadd231ps_fma(ZEXT1632(auVar246),auVar149,auVar29);
    auVar228 = ZEXT1664(auVar246);
    auVar30._4_4_ = fStack_55c * fVar216;
    auVar30._0_4_ = local_560 * fVar213;
    auVar30._8_4_ = fStack_558 * fVar235;
    auVar30._12_4_ = fStack_554 * fVar267;
    auVar30._16_4_ = fStack_550 * fVar277;
    auVar30._20_4_ = fStack_54c * fVar276;
    auVar30._24_4_ = fStack_548 * fVar278;
    auVar30._28_4_ = 0;
    auVar141 = vfmadd231ps_fma(auVar30,_local_540,auVar11);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),_local_520,auVar149);
    fVar200 = auVar246._0_4_;
    fVar279 = auVar109._0_4_;
    fVar214 = auVar246._4_4_;
    fVar280 = auVar109._4_4_;
    fVar215 = auVar246._8_4_;
    fVar98 = auVar109._8_4_;
    fVar217 = auVar246._12_4_;
    fVar130 = auVar109._12_4_;
    auVar31._28_4_ = auVar9._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar130 * fVar217,
                            CONCAT48(fVar98 * fVar215,CONCAT44(fVar280 * fVar214,fVar279 * fVar200))
                           ));
    auVar232 = vsubps_avx(ZEXT1632(auVar141),auVar31);
    auVar32._4_4_ = fVar216 * fVar216;
    auVar32._0_4_ = fVar213 * fVar213;
    auVar32._8_4_ = fVar235 * fVar235;
    auVar32._12_4_ = fVar267 * fVar267;
    auVar32._16_4_ = fVar277 * fVar277;
    auVar32._20_4_ = fVar276 * fVar276;
    auVar32._24_4_ = fVar278 * fVar278;
    auVar32._28_4_ = auVar9._28_4_;
    auVar141 = vfmadd231ps_fma(auVar32,auVar11,auVar11);
    auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar149,auVar149);
    auVar33._28_4_ = local_680._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(fVar217 * fVar217,
                            CONCAT48(fVar215 * fVar215,CONCAT44(fVar214 * fVar214,fVar200 * fVar200)
                                    )));
    auVar9 = vsubps_avx(ZEXT1632(auVar141),auVar33);
    _local_720 = vsqrtps_avx(auVar124);
    fVar200 = (local_720._0_4_ + auVar160._0_4_) * 1.0000002;
    fVar214 = (local_720._4_4_ + auVar160._4_4_) * 1.0000002;
    fVar215 = (local_720._8_4_ + auVar160._8_4_) * 1.0000002;
    fVar217 = (local_720._12_4_ + auVar160._12_4_) * 1.0000002;
    fVar131 = (local_720._16_4_ + auVar160._16_4_) * 1.0000002;
    fVar132 = (local_720._20_4_ + auVar160._20_4_) * 1.0000002;
    fVar133 = (local_720._24_4_ + auVar160._24_4_) * 1.0000002;
    auVar34._4_4_ = fVar214 * fVar214;
    auVar34._0_4_ = fVar200 * fVar200;
    auVar34._8_4_ = fVar215 * fVar215;
    auVar34._12_4_ = fVar217 * fVar217;
    auVar34._16_4_ = fVar131 * fVar131;
    auVar34._20_4_ = fVar132 * fVar132;
    auVar34._24_4_ = fVar133 * fVar133;
    auVar34._28_4_ = local_720._28_4_ + auVar160._28_4_;
    local_5c0._0_4_ = auVar232._0_4_ + auVar232._0_4_;
    local_5c0._4_4_ = auVar232._4_4_ + auVar232._4_4_;
    local_5c0._8_4_ = auVar232._8_4_ + auVar232._8_4_;
    local_5c0._12_4_ = auVar232._12_4_ + auVar232._12_4_;
    local_5c0._16_4_ = auVar232._16_4_ + auVar232._16_4_;
    local_5c0._20_4_ = auVar232._20_4_ + auVar232._20_4_;
    local_5c0._24_4_ = auVar232._24_4_ + auVar232._24_4_;
    local_5c0._28_4_ = auVar232._28_4_ + auVar232._28_4_;
    auVar160 = vsubps_avx(auVar9,auVar34);
    auVar123 = ZEXT1632(auVar109);
    local_580._28_4_ = fStack_544;
    local_580._0_28_ =
         ZEXT1628(CONCAT412(fVar130 * fVar130,
                            CONCAT48(fVar98 * fVar98,CONCAT44(fVar280 * fVar280,fVar279 * fVar279)))
                 );
    local_b00 = vsubps_avx(local_240,local_580);
    local_700._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
    local_700._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
    local_700._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
    local_700._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
    local_700._16_4_ = local_5c0._16_4_ * local_5c0._16_4_;
    local_700._20_4_ = local_5c0._20_4_ * local_5c0._20_4_;
    local_700._24_4_ = local_5c0._24_4_ * local_5c0._24_4_;
    local_700._28_4_ = auVar124._28_4_;
    fVar214 = local_b00._0_4_;
    local_760._0_4_ = fVar214 * 4.0;
    fVar215 = local_b00._4_4_;
    local_760._4_4_ = fVar215 * 4.0;
    fVar217 = local_b00._8_4_;
    fStack_758 = fVar217 * 4.0;
    fVar279 = local_b00._12_4_;
    fStack_754 = fVar279 * 4.0;
    fVar280 = local_b00._16_4_;
    fStack_750 = fVar280 * 4.0;
    fVar98 = local_b00._20_4_;
    fStack_74c = fVar98 * 4.0;
    fVar130 = local_b00._24_4_;
    fStack_748 = fVar130 * 4.0;
    uStack_744 = 0x40800000;
    auVar35._4_4_ = (float)local_760._4_4_ * auVar160._4_4_;
    auVar35._0_4_ = (float)local_760._0_4_ * auVar160._0_4_;
    auVar35._8_4_ = fStack_758 * auVar160._8_4_;
    auVar35._12_4_ = fStack_754 * auVar160._12_4_;
    auVar35._16_4_ = fStack_750 * auVar160._16_4_;
    auVar35._20_4_ = fStack_74c * auVar160._20_4_;
    fVar200 = local_b00._28_4_;
    auVar35._24_4_ = fStack_748 * auVar160._24_4_;
    auVar35._28_4_ = fVar200;
    auVar232 = vsubps_avx(local_700,auVar35);
    auVar124 = vcmpps_avx(auVar232,auVar269,5);
    _local_5a0 = ZEXT1632(auVar246);
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      auVar234 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
    }
    else {
      _local_8c0 = auVar9;
      auVar269 = vcmpps_avx(auVar232,auVar269,5);
      auVar10 = vsqrtps_avx(auVar232);
      auVar261 = ZEXT3264(local_b00);
      auVar281._0_4_ = fVar214 + fVar214;
      auVar281._4_4_ = fVar215 + fVar215;
      auVar281._8_4_ = fVar217 + fVar217;
      auVar281._12_4_ = fVar279 + fVar279;
      auVar281._16_4_ = fVar280 + fVar280;
      auVar281._20_4_ = fVar98 + fVar98;
      auVar281._24_4_ = fVar130 + fVar130;
      auVar281._28_4_ = fVar200 + fVar200;
      auVar232 = vrcpps_avx(auVar281);
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = &DAT_3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
      auVar109 = vfnmadd213ps_fma(auVar281,auVar232,auVar118);
      auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar232,auVar232);
      auVar270._0_4_ = (uint)local_5c0._0_4_ ^ local_620;
      auVar270._4_4_ = (uint)local_5c0._4_4_ ^ uStack_61c;
      auVar270._8_4_ = (uint)local_5c0._8_4_ ^ uStack_618;
      auVar270._12_4_ = (uint)local_5c0._12_4_ ^ uStack_614;
      auVar270._16_4_ = (uint)local_5c0._16_4_ ^ (uint)fStack_610;
      auVar270._20_4_ = (uint)local_5c0._20_4_ ^ (uint)fStack_60c;
      auVar270._24_4_ = (uint)local_5c0._24_4_ ^ (uint)fStack_608;
      auVar270._28_4_ = (uint)local_5c0._28_4_ ^ uStack_604;
      auVar232 = vsubps_avx(auVar270,auVar10);
      auVar36._4_4_ = auVar232._4_4_ * auVar109._4_4_;
      auVar36._0_4_ = auVar232._0_4_ * auVar109._0_4_;
      auVar36._8_4_ = auVar232._8_4_ * auVar109._8_4_;
      auVar36._12_4_ = auVar232._12_4_ * auVar109._12_4_;
      auVar36._16_4_ = auVar232._16_4_ * 0.0;
      auVar36._20_4_ = auVar232._20_4_ * 0.0;
      auVar36._24_4_ = auVar232._24_4_ * 0.0;
      auVar36._28_4_ = auVar232._28_4_;
      auVar232 = vsubps_avx(auVar10,local_5c0);
      auVar37._4_4_ = auVar109._4_4_ * auVar232._4_4_;
      auVar37._0_4_ = auVar109._0_4_ * auVar232._0_4_;
      auVar37._8_4_ = auVar109._8_4_ * auVar232._8_4_;
      auVar37._12_4_ = auVar109._12_4_ * auVar232._12_4_;
      auVar37._16_4_ = auVar232._16_4_ * 0.0;
      auVar37._20_4_ = auVar232._20_4_ * 0.0;
      auVar37._24_4_ = auVar232._24_4_ * 0.0;
      auVar37._28_4_ = auVar232._28_4_;
      auVar109 = vfmadd213ps_fma(auVar123,auVar36,_local_5a0);
      local_4e0 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar178,
                                     CONCAT48(auVar109._8_4_ * fVar162,
                                              CONCAT44(auVar109._4_4_ * fVar135,
                                                       auVar109._0_4_ * fVar134))));
      auVar109 = vfmadd213ps_fma(auVar123,auVar37,_local_5a0);
      local_500 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar178,
                                     CONCAT48(auVar109._8_4_ * fVar162,
                                              CONCAT44(auVar109._4_4_ * fVar135,
                                                       auVar109._0_4_ * fVar134))));
      auVar119._8_4_ = 0x7f800000;
      auVar119._0_8_ = 0x7f8000007f800000;
      auVar119._12_4_ = 0x7f800000;
      auVar119._16_4_ = 0x7f800000;
      auVar119._20_4_ = 0x7f800000;
      auVar119._24_4_ = 0x7f800000;
      auVar119._28_4_ = 0x7f800000;
      local_7c0 = vblendvps_avx(auVar119,auVar36,auVar269);
      auVar65._4_4_ = uStack_79c;
      auVar65._0_4_ = local_7a0;
      auVar65._8_4_ = uStack_798;
      auVar65._12_4_ = uStack_794;
      auVar65._16_4_ = uStack_790;
      auVar65._20_4_ = uStack_78c;
      auVar65._24_4_ = uStack_788;
      auVar65._28_4_ = uStack_784;
      auVar232 = vandps_avx(auVar65,local_580);
      auVar232 = vmaxps_avx(local_420,auVar232);
      auVar38._4_4_ = auVar232._4_4_ * 1.9073486e-06;
      auVar38._0_4_ = auVar232._0_4_ * 1.9073486e-06;
      auVar38._8_4_ = auVar232._8_4_ * 1.9073486e-06;
      auVar38._12_4_ = auVar232._12_4_ * 1.9073486e-06;
      auVar38._16_4_ = auVar232._16_4_ * 1.9073486e-06;
      auVar38._20_4_ = auVar232._20_4_ * 1.9073486e-06;
      auVar38._24_4_ = auVar232._24_4_ * 1.9073486e-06;
      auVar38._28_4_ = auVar232._28_4_;
      auVar232 = vandps_avx(local_b00,auVar65);
      auVar275 = ZEXT3264(auVar232);
      auVar232 = vcmpps_avx(auVar232,auVar38,1);
      auVar120._8_4_ = 0xff800000;
      auVar120._0_8_ = 0xff800000ff800000;
      auVar120._12_4_ = 0xff800000;
      auVar120._16_4_ = 0xff800000;
      auVar120._20_4_ = 0xff800000;
      auVar120._24_4_ = 0xff800000;
      auVar120._28_4_ = 0xff800000;
      auVar117 = vblendvps_avx(auVar120,auVar37,auVar269);
      auVar10 = auVar269 & auVar232;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar10 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar10 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar10 >> 0x7f,0) == '\0') &&
            (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar10 >> 0xbf,0) == '\0') &&
          (auVar10 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar10[0x1f])
      {
        auVar234 = ZEXT3264(local_7c0);
      }
      else {
        auVar124 = vandps_avx(auVar232,auVar269);
        auVar10 = vcmpps_avx(auVar160,_DAT_02020f00,2);
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
        auVar282._8_4_ = 0x7f800000;
        auVar282._0_8_ = 0x7f8000007f800000;
        auVar282._12_4_ = 0x7f800000;
        auVar282._16_4_ = 0x7f800000;
        auVar282._20_4_ = 0x7f800000;
        auVar282._24_4_ = 0x7f800000;
        auVar282._28_4_ = 0x7f800000;
        auVar160 = vblendvps_avx(auVar282,auVar128,auVar10);
        auVar109 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar12 = vpmovsxwd_avx2(auVar109);
        auVar160 = vblendvps_avx(local_7c0,auVar160,auVar12);
        auVar261 = ZEXT3264(auVar160);
        auVar232 = vblendvps_avx(auVar128,auVar282,auVar10);
        auVar275 = ZEXT3264(auVar232);
        auVar117 = vblendvps_avx(auVar117,auVar232,auVar12);
        auVar234 = ZEXT3264(auVar160);
        auVar211._0_8_ = auVar124._0_8_ ^ 0xffffffffffffffff;
        auVar211._8_4_ = auVar124._8_4_ ^ 0xffffffff;
        auVar211._12_4_ = auVar124._12_4_ ^ 0xffffffff;
        auVar211._16_4_ = auVar124._16_4_ ^ 0xffffffff;
        auVar211._20_4_ = auVar124._20_4_ ^ 0xffffffff;
        auVar211._24_4_ = auVar124._24_4_ ^ 0xffffffff;
        auVar211._28_4_ = auVar124._28_4_ ^ 0xffffffff;
        auVar124 = vorps_avx(auVar10,auVar211);
        auVar124 = vandps_avx(auVar269,auVar124);
      }
    }
    auVar249 = ZEXT3264(auVar9);
    auVar160 = local_400 & auVar124;
    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0x7f,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar160 >> 0xbf,0) != '\0') ||
        (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar160[0x1f] < '\0') {
      local_7c0 = auVar123;
      fVar131 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7f0._0_4_;
      auVar196._4_4_ = fVar131;
      auVar196._0_4_ = fVar131;
      auVar196._8_4_ = fVar131;
      auVar196._12_4_ = fVar131;
      auVar196._16_4_ = fVar131;
      auVar196._20_4_ = fVar131;
      auVar196._24_4_ = fVar131;
      auVar196._28_4_ = fVar131;
      _local_8c0 = vmaxps_avx(auVar196,auVar234._0_32_);
      auVar39._4_4_ = local_9e0._4_4_ * fVar216;
      auVar39._0_4_ = (float)local_9e0._0_4_ * fVar213;
      auVar39._8_4_ = local_9e0._8_4_ * fVar235;
      auVar39._12_4_ = local_9e0._12_4_ * fVar267;
      auVar39._16_4_ = local_9e0._16_4_ * fVar277;
      auVar39._20_4_ = local_9e0._20_4_ * fVar276;
      auVar39._24_4_ = local_9e0._24_4_ * fVar278;
      auVar39._28_4_ = auVar114._28_4_;
      auVar109 = vfmadd213ps_fma(auVar11,local_6c0,auVar39);
      fVar213 = (ray->super_RayK<1>).tfar - (float)local_7f0._0_4_;
      auVar197._4_4_ = fVar213;
      auVar197._0_4_ = fVar213;
      auVar197._8_4_ = fVar213;
      auVar197._12_4_ = fVar213;
      auVar197._16_4_ = fVar213;
      auVar197._20_4_ = fVar213;
      auVar197._24_4_ = fVar213;
      auVar197._28_4_ = fVar213;
      auVar246 = vfmadd213ps_fma(auVar149,local_a60,ZEXT1632(auVar109));
      auVar228 = ZEXT3264(CONCAT428(fStack_544,
                                    CONCAT424(fStack_548,
                                              CONCAT420(fStack_54c,
                                                        CONCAT416(fStack_550,
                                                                  CONCAT412(fStack_554,
                                                                            CONCAT48(fStack_558,
                                                                                     CONCAT44(
                                                  fStack_55c,local_560))))))));
      auVar266._0_4_ = local_560 * (float)local_9e0._0_4_;
      auVar266._4_4_ = fStack_55c * local_9e0._4_4_;
      auVar266._8_4_ = fStack_558 * local_9e0._8_4_;
      auVar266._12_4_ = fStack_554 * local_9e0._12_4_;
      auVar266._16_4_ = fStack_550 * local_9e0._16_4_;
      auVar266._20_4_ = fStack_54c * local_9e0._20_4_;
      auVar266._28_36_ = auVar234._28_36_;
      auVar266._24_4_ = fStack_548 * local_9e0._24_4_;
      auVar109 = vfmadd231ps_fma(auVar266._0_32_,_local_540,local_6c0);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar109),_local_520,local_a60);
      auVar66._4_4_ = uStack_79c;
      auVar66._0_4_ = local_7a0;
      auVar66._8_4_ = uStack_798;
      auVar66._12_4_ = uStack_794;
      auVar66._16_4_ = uStack_790;
      auVar66._20_4_ = uStack_78c;
      auVar66._24_4_ = uStack_788;
      auVar66._28_4_ = uStack_784;
      auVar160 = vandps_avx(ZEXT1632(auVar141),auVar66);
      auVar121._8_4_ = 0x219392ef;
      auVar121._0_8_ = 0x219392ef219392ef;
      auVar121._12_4_ = 0x219392ef;
      auVar121._16_4_ = 0x219392ef;
      auVar121._20_4_ = 0x219392ef;
      auVar121._24_4_ = 0x219392ef;
      auVar121._28_4_ = 0x219392ef;
      auVar114 = vcmpps_avx(auVar160,auVar121,1);
      auVar160 = vrcpps_avx(ZEXT1632(auVar141));
      auVar292._8_4_ = 0x3f800000;
      auVar292._0_8_ = &DAT_3f8000003f800000;
      auVar292._12_4_ = 0x3f800000;
      auVar292._16_4_ = 0x3f800000;
      auVar292._20_4_ = 0x3f800000;
      auVar292._24_4_ = 0x3f800000;
      auVar292._28_4_ = 0x3f800000;
      auVar149 = ZEXT1632(auVar141);
      auVar109 = vfnmadd213ps_fma(auVar160,auVar149,auVar292);
      auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar160,auVar160);
      auVar271._0_4_ = auVar141._0_4_ ^ local_620;
      auVar271._4_4_ = auVar141._4_4_ ^ uStack_61c;
      auVar271._8_4_ = auVar141._8_4_ ^ uStack_618;
      auVar271._12_4_ = auVar141._12_4_ ^ uStack_614;
      auVar271._16_4_ = fStack_610;
      auVar271._20_4_ = fStack_60c;
      auVar271._24_4_ = fStack_608;
      auVar271._28_4_ = uStack_604;
      auVar40._4_4_ = auVar109._4_4_ * (float)(auVar246._4_4_ ^ uStack_61c);
      auVar40._0_4_ = auVar109._0_4_ * (float)(auVar246._0_4_ ^ local_620);
      auVar40._8_4_ = auVar109._8_4_ * (float)(auVar246._8_4_ ^ uStack_618);
      auVar40._12_4_ = auVar109._12_4_ * (float)(auVar246._12_4_ ^ uStack_614);
      auVar40._16_4_ = fStack_610 * 0.0;
      auVar40._20_4_ = fStack_60c * 0.0;
      auVar40._24_4_ = fStack_608 * 0.0;
      auVar40._28_4_ = uStack_604;
      auVar160 = vcmpps_avx(auVar149,auVar271,1);
      auVar160 = vorps_avx(auVar114,auVar160);
      auVar293._8_4_ = 0xff800000;
      auVar293._0_8_ = 0xff800000ff800000;
      auVar293._12_4_ = 0xff800000;
      auVar293._16_4_ = 0xff800000;
      auVar293._20_4_ = 0xff800000;
      auVar293._24_4_ = 0xff800000;
      auVar293._28_4_ = 0xff800000;
      auVar160 = vblendvps_avx(auVar40,auVar293,auVar160);
      auVar11 = vminps_avx(auVar197,auVar117);
      local_a60 = vmaxps_avx(_local_8c0,auVar160);
      auVar160 = vcmpps_avx(auVar149,auVar271,6);
      auVar160 = vorps_avx(auVar114,auVar160);
      auVar259._8_4_ = 0x7f800000;
      auVar259._0_8_ = 0x7f8000007f800000;
      auVar259._12_4_ = 0x7f800000;
      auVar259._16_4_ = 0x7f800000;
      auVar259._20_4_ = 0x7f800000;
      auVar259._24_4_ = 0x7f800000;
      auVar259._28_4_ = 0x7f800000;
      auVar261 = ZEXT3264(auVar259);
      auVar160 = vblendvps_avx(auVar40,auVar259,auVar160);
      auVar11 = vminps_avx(auVar11,auVar160);
      auVar294 = ZEXT864(0) << 0x20;
      auVar160 = vsubps_avx(ZEXT832(0) << 0x20,local_900);
      auVar114 = vsubps_avx(ZEXT832(0) << 0x20,local_820);
      auVar41._4_4_ = auVar114._4_4_ * fVar180;
      auVar41._0_4_ = auVar114._0_4_ * fVar179;
      auVar41._8_4_ = auVar114._8_4_ * fVar244;
      auVar41._12_4_ = auVar114._12_4_ * fVar250;
      auVar41._16_4_ = auVar114._16_4_ * fVar251;
      auVar41._20_4_ = auVar114._20_4_ * fVar252;
      auVar41._24_4_ = auVar114._24_4_ * fVar253;
      auVar41._28_4_ = auVar114._28_4_;
      auVar109 = vfnmsub231ps_fma(auVar41,local_940,auVar160);
      auVar269 = ZEXT832(0) << 0x20;
      auVar160 = vsubps_avx(auVar269,_local_980);
      auVar246 = vfnmadd231ps_fma(ZEXT1632(auVar109),local_920,auVar160);
      auVar42._4_4_ = fVar180 * fStack_55c;
      auVar42._0_4_ = fVar179 * local_560;
      auVar42._8_4_ = fVar244 * fStack_558;
      auVar42._12_4_ = fVar250 * fStack_554;
      auVar42._16_4_ = fVar251 * fStack_550;
      auVar42._20_4_ = fVar252 * fStack_54c;
      auVar42._24_4_ = fVar253 * fStack_548;
      auVar42._28_4_ = auVar160._28_4_;
      auVar109 = vfnmsub231ps_fma(auVar42,_local_540,local_940);
      auVar141 = vfnmadd231ps_fma(ZEXT1632(auVar109),_local_520,local_920);
      auVar234 = ZEXT1664(auVar141);
      auVar160 = vandps_avx(ZEXT1632(auVar141),auVar66);
      auVar149 = vrcpps_avx(ZEXT1632(auVar141));
      auVar148._8_4_ = 0x219392ef;
      auVar148._0_8_ = 0x219392ef219392ef;
      auVar148._12_4_ = 0x219392ef;
      auVar148._16_4_ = 0x219392ef;
      auVar148._20_4_ = 0x219392ef;
      auVar148._24_4_ = 0x219392ef;
      auVar148._28_4_ = 0x219392ef;
      auVar114 = vcmpps_avx(auVar160,auVar148,1);
      auVar266 = ZEXT3264(auVar114);
      auVar232 = ZEXT1632(auVar141);
      auVar109 = vfnmadd213ps_fma(auVar149,auVar232,auVar292);
      auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar149,auVar149);
      auVar272._0_4_ = auVar141._0_4_ ^ local_620;
      auVar272._4_4_ = auVar141._4_4_ ^ uStack_61c;
      auVar272._8_4_ = auVar141._8_4_ ^ uStack_618;
      auVar272._12_4_ = auVar141._12_4_ ^ uStack_614;
      auVar272._16_4_ = fStack_610;
      auVar272._20_4_ = fStack_60c;
      auVar272._24_4_ = fStack_608;
      auVar272._28_4_ = uStack_604;
      auVar275 = ZEXT3264(auVar272);
      auVar43._4_4_ = auVar109._4_4_ * (float)(auVar246._4_4_ ^ uStack_61c);
      auVar43._0_4_ = auVar109._0_4_ * (float)(auVar246._0_4_ ^ local_620);
      auVar43._8_4_ = auVar109._8_4_ * (float)(auVar246._8_4_ ^ uStack_618);
      auVar43._12_4_ = auVar109._12_4_ * (float)(auVar246._12_4_ ^ uStack_614);
      auVar43._16_4_ = fStack_610 * 0.0;
      auVar43._20_4_ = fStack_60c * 0.0;
      auVar43._24_4_ = fStack_608 * 0.0;
      auVar43._28_4_ = uStack_604;
      auVar160 = vcmpps_avx(auVar232,auVar272,1);
      auVar160 = vorps_avx(auVar114,auVar160);
      auVar122._8_4_ = 0xff800000;
      auVar122._0_8_ = 0xff800000ff800000;
      auVar122._12_4_ = 0xff800000;
      auVar122._16_4_ = 0xff800000;
      auVar122._20_4_ = 0xff800000;
      auVar122._24_4_ = 0xff800000;
      auVar122._28_4_ = 0xff800000;
      auVar160 = vblendvps_avx(auVar43,auVar122,auVar160);
      _local_8c0 = vmaxps_avx(local_a60,auVar160);
      auVar160 = vcmpps_avx(auVar232,auVar272,6);
      auVar160 = vorps_avx(auVar114,auVar160);
      auVar160 = vblendvps_avx(auVar43,auVar259,auVar160);
      auVar124 = vandps_avx(auVar124,local_400);
      local_480 = vminps_avx(auVar11,auVar160);
      auVar160 = vcmpps_avx(_local_8c0,local_480,2);
      auVar114 = auVar124 & auVar160;
      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar114 >> 0x7f,0) != '\0') ||
            (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar114 >> 0xbf,0) != '\0') ||
          (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar114[0x1f] < '\0') {
        auVar232 = _local_8c0;
        auVar114 = vminps_avx(local_4e0,auVar292);
        auVar56 = ZEXT812(0);
        auVar149 = ZEXT1232(auVar56) << 0x20;
        auVar114 = vmaxps_avx(auVar114,ZEXT1232(auVar56) << 0x20);
        auVar11 = vminps_avx(local_500,auVar292);
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar56) << 0x20);
        auVar44._4_4_ = (auVar114._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar114._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar114._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar114._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar114._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar114._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar114._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar114._28_4_ + 7.0;
        auVar109 = vfmadd213ps_fma(auVar44,local_840,local_960);
        auVar45._4_4_ = (auVar11._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar11._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar11._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar11._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar11._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar11._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar11._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar11._28_4_ + 7.0;
        auVar246 = vfmadd213ps_fma(auVar45,local_840,local_960);
        auVar114 = vminps_avx(local_860,local_880);
        auVar11 = vminps_avx(_local_8a0,local_6e0);
        auVar114 = vminps_avx(auVar114,auVar11);
        auVar114 = vsubps_avx(auVar114,_local_720);
        auVar124 = vandps_avx(auVar160,auVar124);
        local_4e0 = ZEXT1632(auVar109);
        local_500 = ZEXT1632(auVar246);
        auVar46._4_4_ = auVar114._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar114._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar114._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar114._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar114._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar114._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar114._24_4_ * 0.99999976;
        auVar46._28_4_ = auVar114._28_4_;
        auVar160 = vmaxps_avx(auVar269,auVar46);
        auVar47._4_4_ = auVar160._4_4_ * auVar160._4_4_;
        auVar47._0_4_ = auVar160._0_4_ * auVar160._0_4_;
        auVar47._8_4_ = auVar160._8_4_ * auVar160._8_4_;
        auVar47._12_4_ = auVar160._12_4_ * auVar160._12_4_;
        auVar47._16_4_ = auVar160._16_4_ * auVar160._16_4_;
        auVar47._20_4_ = auVar160._20_4_ * auVar160._20_4_;
        auVar47._24_4_ = auVar160._24_4_ * auVar160._24_4_;
        auVar47._28_4_ = auVar160._28_4_;
        auVar114 = vsubps_avx(auVar9,auVar47);
        auVar48._4_4_ = auVar114._4_4_ * (float)local_760._4_4_;
        auVar48._0_4_ = auVar114._0_4_ * (float)local_760._0_4_;
        auVar48._8_4_ = auVar114._8_4_ * fStack_758;
        auVar48._12_4_ = auVar114._12_4_ * fStack_754;
        auVar48._16_4_ = auVar114._16_4_ * fStack_750;
        auVar48._20_4_ = auVar114._20_4_ * fStack_74c;
        auVar48._24_4_ = auVar114._24_4_ * fStack_748;
        auVar48._28_4_ = auVar160._28_4_;
        auVar11 = vsubps_avx(local_700,auVar48);
        auVar160 = vcmpps_avx(auVar11,ZEXT1232(auVar56) << 0x20,5);
        auVar228 = ZEXT3264(auVar160);
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar160 >> 0xbf,0) == '\0') &&
            (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar160[0x1f]) {
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          local_660 = ZEXT832(0) << 0x20;
          local_680 = ZEXT832(0) << 0x20;
          _local_6a0 = ZEXT832(0) << 0x20;
          auVar212 = ZEXT864(0) << 0x20;
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar239._8_4_ = 0xff800000;
          auVar239._0_8_ = 0xff800000ff800000;
          auVar239._12_4_ = 0xff800000;
          auVar239._16_4_ = 0xff800000;
          auVar239._20_4_ = 0xff800000;
          auVar239._24_4_ = 0xff800000;
          auVar239._28_4_ = 0xff800000;
        }
        else {
          local_900 = auVar160;
          _local_980 = auVar124;
          auVar10 = vsqrtps_avx(auVar11);
          auVar240._0_4_ = fVar214 + fVar214;
          auVar240._4_4_ = fVar215 + fVar215;
          auVar240._8_4_ = fVar217 + fVar217;
          auVar240._12_4_ = fVar279 + fVar279;
          auVar240._16_4_ = fVar280 + fVar280;
          auVar240._20_4_ = fVar98 + fVar98;
          auVar240._24_4_ = fVar130 + fVar130;
          auVar240._28_4_ = fVar200 + fVar200;
          auVar149 = vrcpps_avx(auVar240);
          auVar109 = vfnmadd213ps_fma(auVar240,auVar149,auVar292);
          auVar109 = vfmadd132ps_fma(ZEXT1632(auVar109),auVar149,auVar149);
          auVar273._0_4_ = (uint)local_5c0._0_4_ ^ local_620;
          auVar273._4_4_ = (uint)local_5c0._4_4_ ^ uStack_61c;
          auVar273._8_4_ = (uint)local_5c0._8_4_ ^ uStack_618;
          auVar273._12_4_ = (uint)local_5c0._12_4_ ^ uStack_614;
          auVar273._16_4_ = (uint)local_5c0._16_4_ ^ (uint)fStack_610;
          auVar273._20_4_ = (uint)local_5c0._20_4_ ^ (uint)fStack_60c;
          auVar273._24_4_ = (uint)local_5c0._24_4_ ^ (uint)fStack_608;
          auVar273._28_4_ = (uint)local_5c0._28_4_ ^ uStack_604;
          auVar149 = vsubps_avx(auVar273,auVar10);
          auVar12 = vsubps_avx(auVar10,local_5c0);
          fVar200 = auVar149._0_4_ * auVar109._0_4_;
          fVar213 = auVar149._4_4_ * auVar109._4_4_;
          auVar49._4_4_ = fVar213;
          auVar49._0_4_ = fVar200;
          fVar214 = auVar149._8_4_ * auVar109._8_4_;
          auVar49._8_4_ = fVar214;
          fVar216 = auVar149._12_4_ * auVar109._12_4_;
          auVar49._12_4_ = fVar216;
          fVar215 = auVar149._16_4_ * 0.0;
          auVar49._16_4_ = fVar215;
          fVar235 = auVar149._20_4_ * 0.0;
          auVar49._20_4_ = fVar235;
          fVar217 = auVar149._24_4_ * 0.0;
          auVar49._24_4_ = fVar217;
          auVar49._28_4_ = auVar10._28_4_;
          fVar267 = auVar12._0_4_ * auVar109._0_4_;
          fVar276 = auVar12._4_4_ * auVar109._4_4_;
          auVar50._4_4_ = fVar276;
          auVar50._0_4_ = fVar267;
          fVar277 = auVar12._8_4_ * auVar109._8_4_;
          auVar50._8_4_ = fVar277;
          fVar278 = auVar12._12_4_ * auVar109._12_4_;
          auVar50._12_4_ = fVar278;
          fVar279 = auVar12._16_4_ * 0.0;
          auVar50._16_4_ = fVar279;
          fVar280 = auVar12._20_4_ * 0.0;
          auVar50._20_4_ = fVar280;
          fVar98 = auVar12._24_4_ * 0.0;
          auVar50._24_4_ = fVar98;
          auVar50._28_4_ = auVar149._28_4_;
          auVar109 = vfmadd213ps_fma(auVar123,auVar49,_local_5a0);
          auVar246 = vfmadd213ps_fma(auVar123,auVar50,_local_5a0);
          auVar149 = ZEXT1632(CONCAT412(auVar109._12_4_ * fVar178,
                                        CONCAT48(auVar109._8_4_ * fVar162,
                                                 CONCAT44(auVar109._4_4_ * fVar135,
                                                          auVar109._0_4_ * fVar134))));
          auVar89._28_4_ = auVar9._28_4_;
          auVar89._0_28_ =
               ZEXT1628(CONCAT412(fVar178 * auVar246._12_4_,
                                  CONCAT48(fVar162 * auVar246._8_4_,
                                           CONCAT44(fVar135 * auVar246._4_4_,
                                                    fVar134 * auVar246._0_4_))));
          auVar109 = vfmadd213ps_fma(local_680,auVar149,local_ae0);
          auVar246 = vfmadd213ps_fma(local_680,auVar89,local_ae0);
          auVar141 = vfmadd213ps_fma(_local_6a0,auVar149,_local_780);
          auVar7 = vfmadd213ps_fma(_local_6a0,auVar89,_local_780);
          auVar8 = vfmadd213ps_fma(auVar149,local_660,local_640);
          auVar102 = vfmadd213ps_fma(local_660,auVar89,local_640);
          auVar51._4_4_ = (float)local_520._4_4_ * fVar213;
          auVar51._0_4_ = (float)local_520._0_4_ * fVar200;
          auVar51._8_4_ = fStack_518 * fVar214;
          auVar51._12_4_ = fStack_514 * fVar216;
          auVar51._16_4_ = fStack_510 * fVar215;
          auVar51._20_4_ = fStack_50c * fVar235;
          auVar51._24_4_ = fStack_508 * fVar217;
          auVar51._28_4_ = 0;
          auVar123 = vsubps_avx(auVar51,ZEXT1632(auVar109));
          auVar150._0_4_ = (float)local_540._0_4_ * fVar200;
          auVar150._4_4_ = (float)local_540._4_4_ * fVar213;
          auVar150._8_4_ = fStack_538 * fVar214;
          auVar150._12_4_ = fStack_534 * fVar216;
          auVar150._16_4_ = fStack_530 * fVar215;
          auVar150._20_4_ = fStack_52c * fVar235;
          auVar150._24_4_ = fStack_528 * fVar217;
          auVar150._28_4_ = 0;
          auVar149 = vsubps_avx(auVar150,ZEXT1632(auVar141));
          auVar172._0_4_ = local_560 * fVar200;
          auVar172._4_4_ = fStack_55c * fVar213;
          auVar172._8_4_ = fStack_558 * fVar214;
          auVar172._12_4_ = fStack_554 * fVar216;
          auVar172._16_4_ = fStack_550 * fVar215;
          auVar172._20_4_ = fStack_54c * fVar235;
          auVar172._24_4_ = fStack_548 * fVar217;
          auVar172._28_4_ = 0;
          auVar9 = vsubps_avx(auVar172,ZEXT1632(auVar8));
          auVar212 = ZEXT3264(auVar9);
          auVar241._0_4_ = (float)local_520._0_4_ * fVar267;
          auVar241._4_4_ = (float)local_520._4_4_ * fVar276;
          auVar241._8_4_ = fStack_518 * fVar277;
          auVar241._12_4_ = fStack_514 * fVar278;
          auVar241._16_4_ = fStack_510 * fVar279;
          auVar241._20_4_ = fStack_50c * fVar280;
          auVar241._24_4_ = fStack_508 * fVar98;
          auVar241._28_4_ = 0;
          local_660 = vsubps_avx(auVar241,ZEXT1632(auVar246));
          auVar52._4_4_ = fVar276 * (float)local_540._4_4_;
          auVar52._0_4_ = fVar267 * (float)local_540._0_4_;
          auVar52._8_4_ = fVar277 * fStack_538;
          auVar52._12_4_ = fVar278 * fStack_534;
          auVar52._16_4_ = fVar279 * fStack_530;
          auVar52._20_4_ = fVar280 * fStack_52c;
          auVar52._24_4_ = fVar98 * fStack_528;
          auVar52._28_4_ = local_660._28_4_;
          local_680 = vsubps_avx(auVar52,ZEXT1632(auVar7));
          auVar53._4_4_ = fStack_55c * fVar276;
          auVar53._0_4_ = local_560 * fVar267;
          auVar53._8_4_ = fStack_558 * fVar277;
          auVar53._12_4_ = fStack_554 * fVar278;
          auVar53._16_4_ = fStack_550 * fVar279;
          auVar53._20_4_ = fStack_54c * fVar280;
          auVar53._24_4_ = fStack_548 * fVar98;
          auVar53._28_4_ = local_680._28_4_;
          _local_6a0 = vsubps_avx(auVar53,ZEXT1632(auVar102));
          auVar11 = vcmpps_avx(auVar11,auVar269,5);
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar233 = vblendvps_avx(auVar242,auVar49,auVar11);
          auVar67._4_4_ = uStack_79c;
          auVar67._0_4_ = local_7a0;
          auVar67._8_4_ = uStack_798;
          auVar67._12_4_ = uStack_794;
          auVar67._16_4_ = uStack_790;
          auVar67._20_4_ = uStack_78c;
          auVar67._24_4_ = uStack_788;
          auVar67._28_4_ = uStack_784;
          auVar9 = vandps_avx(auVar67,local_580);
          auVar9 = vmaxps_avx(local_420,auVar9);
          auVar54._4_4_ = auVar9._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar9._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar9._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar9._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar9._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar9._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar9._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar9._28_4_;
          auVar9 = vandps_avx(auVar67,local_b00);
          auVar9 = vcmpps_avx(auVar9,auVar54,1);
          auVar243._8_4_ = 0xff800000;
          auVar243._0_8_ = 0xff800000ff800000;
          auVar243._12_4_ = 0xff800000;
          auVar243._16_4_ = 0xff800000;
          auVar243._20_4_ = 0xff800000;
          auVar243._24_4_ = 0xff800000;
          auVar243._28_4_ = 0xff800000;
          auVar239 = vblendvps_avx(auVar243,auVar50,auVar11);
          auVar269 = auVar11 & auVar9;
          if ((((((((auVar269 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar269 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar269 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar269 >> 0x7f,0) == '\0') &&
                (auVar269 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar269 >> 0xbf,0) == '\0') &&
              (auVar269 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar269[0x1f]) {
            auVar228 = ZEXT3264(auVar160);
          }
          else {
            auVar160 = vandps_avx(auVar9,auVar11);
            auVar9 = vcmpps_avx(auVar114,ZEXT832(0) << 0x20,2);
            auVar274._8_4_ = 0xff800000;
            auVar274._0_8_ = 0xff800000ff800000;
            auVar274._12_4_ = 0xff800000;
            auVar274._16_4_ = 0xff800000;
            auVar274._20_4_ = 0xff800000;
            auVar274._24_4_ = 0xff800000;
            auVar274._28_4_ = 0xff800000;
            auVar283._8_4_ = 0x7f800000;
            auVar283._0_8_ = 0x7f8000007f800000;
            auVar283._12_4_ = 0x7f800000;
            auVar283._16_4_ = 0x7f800000;
            auVar283._20_4_ = 0x7f800000;
            auVar283._24_4_ = 0x7f800000;
            auVar283._28_4_ = 0x7f800000;
            auVar114 = vblendvps_avx(auVar283,auVar274,auVar9);
            auVar109 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
            auVar269 = vpmovsxwd_avx2(auVar109);
            auVar233 = vblendvps_avx(auVar233,auVar114,auVar269);
            auVar114 = vblendvps_avx(auVar274,auVar283,auVar9);
            auVar239 = vblendvps_avx(auVar239,auVar114,auVar269);
            auVar227._0_8_ = auVar160._0_8_ ^ 0xffffffffffffffff;
            auVar227._8_4_ = auVar160._8_4_ ^ 0xffffffff;
            auVar227._12_4_ = auVar160._12_4_ ^ 0xffffffff;
            auVar227._16_4_ = auVar160._16_4_ ^ 0xffffffff;
            auVar227._20_4_ = auVar160._20_4_ ^ 0xffffffff;
            auVar227._24_4_ = auVar160._24_4_ ^ 0xffffffff;
            auVar227._28_4_ = auVar160._28_4_ ^ 0xffffffff;
            auVar160 = vorps_avx(auVar9,auVar227);
            auVar160 = vandps_avx(auVar11,auVar160);
            auVar228 = ZEXT3264(auVar160);
          }
        }
        uVar94 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar260._4_4_ = uVar94;
        auVar260._0_4_ = uVar94;
        auVar260._8_4_ = uVar94;
        auVar260._12_4_ = uVar94;
        auVar260._16_4_ = uVar94;
        auVar260._20_4_ = uVar94;
        auVar260._24_4_ = uVar94;
        auVar260._28_4_ = uVar94;
        auVar261 = ZEXT3264(auVar260);
        uVar94 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar265._4_4_ = uVar94;
        auVar265._0_4_ = uVar94;
        auVar265._8_4_ = uVar94;
        auVar265._12_4_ = uVar94;
        auVar265._16_4_ = uVar94;
        auVar265._20_4_ = uVar94;
        auVar265._24_4_ = uVar94;
        auVar265._28_4_ = uVar94;
        auVar266 = ZEXT3264(auVar265);
        fVar200 = (ray->super_RayK<1>).dir.field_0.m128[2];
        auVar249 = ZEXT3264(_local_8c0);
        local_460 = _local_8c0;
        local_440 = vminps_avx(local_480,auVar233);
        _local_4a0 = vmaxps_avx(_local_8c0,auVar239);
        auVar275 = ZEXT3264(_local_4a0);
        auVar160 = vcmpps_avx(_local_8c0,local_440,2);
        local_7c0 = vandps_avx(auVar160,auVar124);
        local_5e0 = local_7c0;
        auVar160 = vcmpps_avx(_local_4a0,local_480,2);
        local_600 = vandps_avx(auVar160,auVar124);
        auVar234 = ZEXT3264(local_600);
        auVar124 = vorps_avx(local_600,local_7c0);
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0xbf,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar124[0x1f] < '\0') {
          local_5c0 = local_600;
          _local_5a0 = _local_4a0;
          local_260._0_8_ = auVar228._0_8_ ^ 0xffffffffffffffff;
          local_260._8_4_ = auVar228._8_4_ ^ 0xffffffff;
          local_260._12_4_ = auVar228._12_4_ ^ 0xffffffff;
          local_260._16_4_ = auVar228._16_4_ ^ 0xffffffff;
          local_260._20_4_ = auVar228._20_4_ ^ 0xffffffff;
          local_260._24_4_ = auVar228._24_4_ ^ 0xffffffff;
          local_260._28_4_ = auVar228._28_4_ ^ 0xffffffff;
          auVar177._0_4_ = fVar200 * auVar212._0_4_;
          auVar177._4_4_ = fVar200 * auVar212._4_4_;
          auVar177._8_4_ = fVar200 * auVar212._8_4_;
          auVar177._12_4_ = fVar200 * auVar212._12_4_;
          auVar177._16_4_ = fVar200 * auVar212._16_4_;
          auVar177._20_4_ = fVar200 * auVar212._20_4_;
          auVar177._28_36_ = auVar212._28_36_;
          auVar177._24_4_ = fVar200 * auVar212._24_4_;
          auVar275 = ZEXT3264(auVar265);
          auVar109 = vfmadd213ps_fma(auVar149,auVar265,auVar177._0_32_);
          auVar266 = ZEXT3264(auVar260);
          auVar109 = vfmadd213ps_fma(auVar123,auVar260,ZEXT1632(auVar109));
          auVar68._4_4_ = uStack_79c;
          auVar68._0_4_ = local_7a0;
          auVar68._8_4_ = uStack_798;
          auVar68._12_4_ = uStack_794;
          auVar68._16_4_ = uStack_790;
          auVar68._20_4_ = uStack_78c;
          auVar68._24_4_ = uStack_788;
          auVar68._28_4_ = uStack_784;
          auVar124 = vandps_avx(ZEXT1632(auVar109),auVar68);
          auVar151._8_4_ = 0x3e99999a;
          auVar151._0_8_ = 0x3e99999a3e99999a;
          auVar151._12_4_ = 0x3e99999a;
          auVar151._16_4_ = 0x3e99999a;
          auVar151._20_4_ = 0x3e99999a;
          auVar151._24_4_ = 0x3e99999a;
          auVar151._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar151,1);
          auVar124 = vorps_avx(auVar124,local_260);
          auVar152._8_4_ = 3;
          auVar152._0_8_ = 0x300000003;
          auVar152._12_4_ = 3;
          auVar152._16_4_ = 3;
          auVar152._20_4_ = 3;
          auVar152._24_4_ = 3;
          auVar152._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar173,auVar152,auVar124);
          uVar94 = (undefined4)uVar95;
          local_280._4_4_ = uVar94;
          local_280._0_4_ = uVar94;
          local_280._8_4_ = uVar94;
          local_280._12_4_ = uVar94;
          local_280._16_4_ = uVar94;
          local_280._20_4_ = uVar94;
          local_280._24_4_ = uVar94;
          local_280._28_4_ = uVar94;
          local_580 = vpcmpgtd_avx2(auVar124,local_280);
          local_5e0 = vpandn_avx2(local_580,local_7c0);
          auVar212 = ZEXT3264(local_5e0);
          auVar124 = local_7c0 & ~local_580;
          local_640 = ZEXT1632(CONCAT88(auVar258._8_8_,uVar95));
          fVar213 = fVar200;
          fVar214 = fVar200;
          fVar216 = fVar200;
          fVar215 = fVar200;
          fVar235 = fVar200;
          fVar217 = fVar200;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            auVar246 = vminps_avx(local_a10,local_a30);
            auVar109 = vmaxps_avx(local_a10,local_a30);
            auVar258 = vminps_avx(local_a20,_local_a40);
            auVar141 = vminps_avx(auVar246,auVar258);
            auVar246 = vmaxps_avx(local_a20,_local_a40);
            auVar258 = vmaxps_avx(auVar109,auVar246);
            auVar109 = vandps_avx(auVar141,local_8d0);
            auVar246 = vandps_avx(auVar258,local_8d0);
            auVar109 = vmaxps_avx(auVar109,auVar246);
            auVar246 = vmovshdup_avx(auVar109);
            auVar246 = vmaxss_avx(auVar246,auVar109);
            auVar109 = vshufpd_avx(auVar109,auVar109,1);
            auVar109 = vmaxss_avx(auVar109,auVar246);
            local_820._0_4_ = auVar109._0_4_ * 1.9073486e-06;
            auVar109 = vshufps_avx(auVar258,auVar258,0xff);
            _local_760 = auVar109;
            local_780._4_4_ = (float)local_8c0._4_4_ + (float)local_740._4_4_;
            local_780._0_4_ = (float)local_8c0._0_4_ + (float)local_740._0_4_;
            fStack_778 = fStack_8b8 + fStack_738;
            fStack_774 = fStack_8b4 + fStack_734;
            fStack_770 = fStack_8b0 + fStack_730;
            fStack_76c = fStack_8ac + fStack_72c;
            fStack_768 = fStack_8a8 + fStack_728;
            fStack_764 = fStack_8a4 + fStack_724;
            local_860 = auVar260;
            local_880 = auVar265;
            local_8a0._4_4_ = fVar200;
            local_8a0._0_4_ = fVar200;
            fStack_898 = fVar200;
            fStack_894 = fVar200;
            fStack_890 = fVar200;
            fStack_88c = fVar200;
            fStack_888 = fVar200;
            fStack_884 = fVar200;
            _local_8c0 = auVar232;
            local_6e0 = auVar14;
            do {
              auVar153._8_4_ = 0x7f800000;
              auVar153._0_8_ = 0x7f8000007f800000;
              auVar153._12_4_ = 0x7f800000;
              auVar153._16_4_ = 0x7f800000;
              auVar153._20_4_ = 0x7f800000;
              auVar153._24_4_ = 0x7f800000;
              auVar153._28_4_ = 0x7f800000;
              auVar124 = auVar212._0_32_;
              auVar160 = vblendvps_avx(auVar153,_local_8c0,auVar124);
              auVar114 = vshufps_avx(auVar160,auVar160,0xb1);
              auVar114 = vminps_avx(auVar160,auVar114);
              auVar9 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar9);
              auVar9 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar9);
              auVar160 = vcmpps_avx(auVar160,auVar114,0);
              auVar114 = auVar124 & auVar160;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar160,auVar124);
              }
              uVar90 = vmovmskps_avx(auVar124);
              iVar13 = 0;
              for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                iVar13 = iVar13 + 1;
              }
              uVar90 = iVar13 << 2;
              *(undefined4 *)(local_5e0 + uVar90) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              local_900._0_16_ = (undefined1  [16])aVar2;
              auVar109 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar249 = ZEXT464(*(uint *)(local_4e0 + uVar90));
              if (auVar109._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_4e0 + uVar90));
                local_b00._0_16_ = ZEXT416((uint)*(float *)(local_460 + uVar90));
                fVar200 = sqrtf(auVar109._0_4_);
                auVar249 = ZEXT1664(local_ae0._0_16_);
                fVar267 = (float)local_b00._0_4_;
                uVar94 = local_b00._4_4_;
                uVar284 = local_b00._8_4_;
                uVar286 = local_b00._12_4_;
              }
              else {
                auVar109 = vsqrtss_avx(auVar109,auVar109);
                fVar200 = auVar109._0_4_;
                fVar267 = *(float *)(local_460 + uVar90);
                uVar94 = 0;
                uVar284 = 0;
                uVar286 = 0;
              }
              local_840._0_4_ = fVar200 * 1.9073486e-06;
              lVar96 = 4;
              do {
                auVar124 = local_b00;
                fVar213 = auVar249._0_4_;
                fVar235 = 1.0 - fVar213;
                local_a60._0_16_ = ZEXT416((uint)fVar235);
                fVar216 = fVar235 * fVar235 * fVar235;
                fVar215 = fVar213 * fVar213;
                fVar214 = fVar213 * fVar215;
                auVar246 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                           ZEXT416((uint)fVar214));
                fVar200 = fVar213 * fVar235;
                auVar258 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar200 * 6.0)),
                                           ZEXT416((uint)(fVar235 * fVar200)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar200 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar213 * fVar200)));
                auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar214),
                                           ZEXT416((uint)fVar216));
                fVar213 = (auVar109._0_4_ + auVar141._0_4_) * 0.16666667;
                fVar214 = fVar214 * 0.16666667;
                auVar139._0_4_ = fVar214 * (float)local_a40._0_4_;
                auVar139._4_4_ = fVar214 * (float)local_a40._4_4_;
                auVar139._8_4_ = fVar214 * fStack_a38;
                auVar139._12_4_ = fVar214 * fStack_a34;
                auVar182._4_4_ = fVar213;
                auVar182._0_4_ = fVar213;
                auVar182._8_4_ = fVar213;
                auVar182._12_4_ = fVar213;
                auVar109 = vfmadd132ps_fma(auVar182,auVar139,local_a20);
                fVar213 = (auVar246._0_4_ + auVar258._0_4_) * 0.16666667;
                auVar140._4_4_ = fVar213;
                auVar140._0_4_ = fVar213;
                auVar140._8_4_ = fVar213;
                auVar140._12_4_ = fVar213;
                auVar109 = vfmadd132ps_fma(auVar140,auVar109,local_a30);
                auVar164._4_4_ = fVar267;
                auVar164._0_4_ = fVar267;
                auVar164._8_4_ = fVar267;
                auVar164._12_4_ = fVar267;
                auVar246 = vfmadd213ps_fma(auVar164,local_900._0_16_,_DAT_01feba10);
                fVar216 = fVar216 * 0.16666667;
                auVar104._4_4_ = fVar216;
                auVar104._0_4_ = fVar216;
                auVar104._8_4_ = fVar216;
                auVar104._12_4_ = fVar216;
                auVar109 = vfmadd132ps_fma(auVar104,auVar109,local_a10);
                local_6c0._0_16_ = auVar109;
                auVar109 = vsubps_avx(auVar246,auVar109);
                _local_980 = auVar109;
                auVar109 = vdpps_avx(auVar109,auVar109,0x7f);
                local_ae0._0_16_ = auVar249._0_16_;
                local_b00._4_4_ = uVar94;
                local_b00._0_4_ = fVar267;
                local_b00._8_4_ = uVar284;
                local_b00._16_16_ = auVar124._16_16_;
                local_b00._12_4_ = uVar286;
                local_ac0._0_16_ = auVar109;
                if (auVar109._0_4_ < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar235);
                  local_9e0._0_4_ = fVar215;
                  local_920._0_4_ = fVar200;
                  auVar275._0_4_ = sqrtf(auVar109._0_4_);
                  auVar275._4_60_ = extraout_var;
                  auVar109 = auVar275._0_16_;
                  fVar215 = (float)local_9e0._0_4_;
                  fVar200 = (float)local_920._0_4_;
                  auVar246 = local_ae0._0_16_;
                  fVar267 = (float)local_b00._0_4_;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar109,auVar109);
                  auVar246 = auVar249._0_16_;
                }
                fVar213 = local_a60._0_4_;
                auVar105._4_4_ = fVar213;
                auVar105._0_4_ = fVar213;
                auVar105._8_4_ = fVar213;
                auVar105._12_4_ = fVar213;
                auVar141 = vfnmsub213ss_fma(auVar246,auVar246,ZEXT416((uint)(fVar200 * 4.0)));
                auVar258 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * 4.0)),local_a60._0_16_,
                                           local_a60._0_16_);
                fVar200 = fVar213 * -fVar213 * 0.5;
                fVar213 = auVar141._0_4_ * 0.5;
                fVar214 = auVar258._0_4_ * 0.5;
                fVar215 = fVar215 * 0.5;
                auVar223._0_4_ = (float)local_a40._0_4_ * fVar215;
                auVar223._4_4_ = (float)local_a40._4_4_ * fVar215;
                auVar223._8_4_ = fStack_a38 * fVar215;
                auVar223._12_4_ = fStack_a34 * fVar215;
                auVar183._4_4_ = fVar214;
                auVar183._0_4_ = fVar214;
                auVar183._8_4_ = fVar214;
                auVar183._12_4_ = fVar214;
                auVar258 = vfmadd213ps_fma(auVar183,local_a20,auVar223);
                auVar203._4_4_ = fVar213;
                auVar203._0_4_ = fVar213;
                auVar203._8_4_ = fVar213;
                auVar203._12_4_ = fVar213;
                auVar258 = vfmadd213ps_fma(auVar203,local_a30,auVar258);
                auVar257._4_4_ = fVar200;
                auVar257._0_4_ = fVar200;
                auVar257._8_4_ = fVar200;
                auVar257._12_4_ = fVar200;
                auVar7 = vfmadd213ps_fma(auVar257,local_a10,auVar258);
                auVar258 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar246)
                ;
                auVar141 = vfmadd231ss_fma(local_a60._0_16_,auVar246,SUB6416(ZEXT464(0xc0000000),0))
                ;
                fVar200 = auVar246._0_4_;
                auVar184._0_4_ = (float)local_a40._0_4_ * fVar200;
                auVar184._4_4_ = (float)local_a40._4_4_ * fVar200;
                auVar184._8_4_ = fStack_a38 * fVar200;
                auVar184._12_4_ = fStack_a34 * fVar200;
                uVar94 = auVar141._0_4_;
                auVar204._4_4_ = uVar94;
                auVar204._0_4_ = uVar94;
                auVar204._8_4_ = uVar94;
                auVar204._12_4_ = uVar94;
                auVar246 = vfmadd213ps_fma(auVar204,local_a20,auVar184);
                auVar165._0_4_ = auVar258._0_4_;
                auVar165._4_4_ = auVar165._0_4_;
                auVar165._8_4_ = auVar165._0_4_;
                auVar165._12_4_ = auVar165._0_4_;
                auVar246 = vfmadd213ps_fma(auVar165,local_a30,auVar246);
                auVar8 = vfmadd231ps_fma(auVar246,local_a10,auVar105);
                auVar258 = vdpps_avx(auVar7,auVar7,0x7f);
                auVar246 = vblendps_avx(auVar258,_DAT_01feba10,0xe);
                auVar141 = vrsqrtss_avx(auVar246,auVar246);
                fVar200 = auVar141._0_4_;
                fVar214 = auVar258._0_4_;
                fVar200 = fVar200 * 1.5 + fVar214 * -0.5 * fVar200 * fVar200 * fVar200;
                auVar141 = vdpps_avx(auVar7,auVar8,0x7f);
                auVar166._0_4_ = auVar8._0_4_ * fVar214;
                auVar166._4_4_ = auVar8._4_4_ * fVar214;
                auVar166._8_4_ = auVar8._8_4_ * fVar214;
                auVar166._12_4_ = auVar8._12_4_ * fVar214;
                fVar213 = auVar141._0_4_;
                auVar224._0_4_ = auVar7._0_4_ * fVar213;
                auVar224._4_4_ = auVar7._4_4_ * fVar213;
                fVar216 = auVar7._8_4_;
                auVar224._8_4_ = fVar216 * fVar213;
                fVar215 = auVar7._12_4_;
                auVar224._12_4_ = fVar215 * fVar213;
                auVar141 = vsubps_avx(auVar166,auVar224);
                auVar246 = vrcpss_avx(auVar246,auVar246);
                auVar8 = vfnmadd213ss_fma(auVar246,auVar258,ZEXT416(0x40000000));
                fVar213 = auVar246._0_4_ * auVar8._0_4_;
                auVar246 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(fVar267 * (float)local_840._0_4_)));
                auVar294 = ZEXT1664(auVar246);
                auVar247._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = -fVar216;
                auVar247._12_4_ = -fVar215;
                local_960._0_4_ = fVar200 * auVar141._0_4_ * fVar213;
                local_960._4_4_ = fVar200 * auVar141._4_4_ * fVar213;
                local_960._8_4_ = fVar200 * auVar141._8_4_ * fVar213;
                local_960._12_4_ = fVar200 * auVar141._12_4_ * fVar213;
                local_940._0_4_ = auVar7._0_4_ * fVar200;
                local_940._4_4_ = auVar7._4_4_ * fVar200;
                local_940._8_4_ = fVar216 * fVar200;
                local_940._12_4_ = fVar215 * fVar200;
                local_a60._0_16_ = auVar7;
                local_9e0._0_4_ = auVar246._0_4_;
                if (fVar214 < -fVar214) {
                  local_920._0_4_ = auVar109._0_4_;
                  local_a00._0_16_ = auVar247;
                  fVar200 = sqrtf(fVar214);
                  auVar294 = ZEXT464((uint)local_9e0._0_4_);
                  auVar109 = ZEXT416((uint)local_920._0_4_);
                  auVar247 = local_a00._0_16_;
                }
                else {
                  auVar246 = vsqrtss_avx(auVar258,auVar258);
                  fVar200 = auVar246._0_4_;
                }
                local_920._0_16_ = vdpps_avx(_local_980,local_940._0_16_,0x7f);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar109,auVar294._0_16_);
                auVar246 = vdpps_avx(auVar247,local_940._0_16_,0x7f);
                auVar258 = vdpps_avx(_local_980,local_960._0_16_,0x7f);
                auVar141 = vdpps_avx(local_900._0_16_,local_940._0_16_,0x7f);
                auVar109 = vfmadd213ss_fma(ZEXT416((uint)(auVar109._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_820._0_4_ / fVar200)),auVar7)
                ;
                local_a00._0_4_ = auVar109._0_4_;
                auVar106._0_4_ = local_920._0_4_ * local_920._0_4_;
                auVar106._4_4_ = local_920._4_4_ * local_920._4_4_;
                auVar106._8_4_ = local_920._8_4_ * local_920._8_4_;
                auVar106._12_4_ = local_920._12_4_ * local_920._12_4_;
                auVar109 = vdpps_avx(_local_980,auVar247,0x7f);
                auVar8 = vsubps_avx(local_ac0._0_16_,auVar106);
                auVar7 = vrsqrtss_avx(auVar8,auVar8);
                fVar213 = auVar8._0_4_;
                fVar200 = auVar7._0_4_;
                fVar200 = fVar200 * 1.5 + fVar213 * -0.5 * fVar200 * fVar200 * fVar200;
                auVar7 = vdpps_avx(_local_980,local_900._0_16_,0x7f);
                local_940._0_16_ = ZEXT416((uint)(auVar246._0_4_ + auVar258._0_4_));
                local_960._0_16_ = vfnmadd231ss_fma(auVar109,local_920._0_16_,local_940._0_16_);
                auVar109 = vfnmadd231ss_fma(auVar7,local_920._0_16_,auVar141);
                if (fVar213 < 0.0) {
                  local_6e0._0_16_ = auVar141;
                  local_700._0_4_ = fVar200;
                  _local_720 = auVar109;
                  fVar213 = sqrtf(fVar213);
                  auVar294 = ZEXT464((uint)local_9e0._0_4_);
                  fVar200 = (float)local_700._0_4_;
                  auVar109 = _local_720;
                  auVar141 = local_6e0._0_16_;
                }
                else {
                  auVar246 = vsqrtss_avx(auVar8,auVar8);
                  fVar213 = auVar246._0_4_;
                }
                auVar266 = ZEXT3264(local_860);
                auVar275 = ZEXT3264(local_880);
                auVar246 = vpermilps_avx(local_6c0._0_16_,0xff);
                auVar7 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
                auVar258 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar200),auVar7);
                auVar185._0_8_ = auVar141._0_8_ ^ 0x8000000080000000;
                auVar185._8_4_ = auVar141._8_4_ ^ 0x80000000;
                auVar185._12_4_ = auVar141._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar258._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar258._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar258._12_4_ ^ 0x80000000;
                auVar234 = ZEXT1664(local_940._0_16_);
                auVar109 = ZEXT416((uint)(auVar109._0_4_ * fVar200));
                auVar258 = vfmsub231ss_fma(ZEXT416((uint)(auVar141._0_4_ * auVar258._0_4_)),
                                           local_940._0_16_,auVar109);
                auVar109 = vinsertps_avx(auVar109,auVar185,0x10);
                uVar94 = auVar258._0_4_;
                auVar186._4_4_ = uVar94;
                auVar186._0_4_ = uVar94;
                auVar186._8_4_ = uVar94;
                auVar186._12_4_ = uVar94;
                auVar109 = vdivps_avx(auVar109,auVar186);
                auVar261 = ZEXT1664(local_920._0_16_);
                auVar141 = ZEXT416((uint)(fVar213 - auVar246._0_4_));
                auVar258 = vinsertps_avx(local_920._0_16_,auVar141,0x10);
                auVar228 = ZEXT1664(auVar258);
                auVar167._0_4_ = auVar258._0_4_ * auVar109._0_4_;
                auVar167._4_4_ = auVar258._4_4_ * auVar109._4_4_;
                auVar167._8_4_ = auVar258._8_4_ * auVar109._8_4_;
                auVar167._12_4_ = auVar258._12_4_ * auVar109._12_4_;
                auVar109 = vinsertps_avx(auVar205,local_940._0_16_,0x1c);
                auVar109 = vdivps_avx(auVar109,auVar186);
                auVar187._0_4_ = auVar258._0_4_ * auVar109._0_4_;
                auVar187._4_4_ = auVar258._4_4_ * auVar109._4_4_;
                auVar187._8_4_ = auVar258._8_4_ * auVar109._8_4_;
                auVar187._12_4_ = auVar258._12_4_ * auVar109._12_4_;
                auVar109 = vhaddps_avx(auVar167,auVar167);
                auVar246 = vhaddps_avx(auVar187,auVar187);
                fVar276 = (float)local_ae0._0_4_ - auVar109._0_4_;
                auVar249 = ZEXT464((uint)fVar276);
                fVar267 = (float)local_b00._0_4_ - auVar246._0_4_;
                uVar94 = 0;
                uVar284 = 0;
                uVar286 = 0;
                auVar109 = vandps_avx(local_920._0_16_,local_8d0);
                fVar213 = (float)local_8a0._4_4_;
                fVar214 = fStack_898;
                fVar216 = fStack_894;
                fVar215 = fStack_890;
                fVar235 = fStack_88c;
                fVar217 = fStack_888;
                fVar200 = (float)local_8a0._0_4_;
                if ((float)local_a00._0_4_ <= auVar109._0_4_) {
LAB_0165e9e0:
                  bVar55 = false;
                }
                else {
                  auVar246 = vfmadd231ss_fma(ZEXT416((uint)(auVar294._0_4_ + (float)local_a00._0_4_)
                                                    ),_local_760,ZEXT416(0x36000000));
                  auVar109 = vandps_avx(auVar141,local_8d0);
                  if (auVar246._0_4_ <= auVar109._0_4_) goto LAB_0165e9e0;
                  fVar267 = fVar267 + (float)local_7f0._0_4_;
                  uVar94 = 0;
                  uVar284 = 0;
                  uVar286 = 0;
                  bVar55 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar267) &&
                       (fVar277 = (ray->super_RayK<1>).tfar, fVar267 <= fVar277)) &&
                      (0.0 <= fVar276)) && (fVar276 <= 1.0)) {
                    auVar109 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar278 = auVar109._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_b08].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar278 = fVar278 * 1.5 + local_ac0._0_4_ * -0.5 * fVar278 * fVar278 * fVar278
                      ;
                      auVar142._0_4_ = fVar278 * (float)local_980._0_4_;
                      auVar142._4_4_ = fVar278 * (float)local_980._4_4_;
                      auVar142._8_4_ = fVar278 * fStack_978;
                      auVar142._12_4_ = fVar278 * fStack_974;
                      auVar7 = vfmadd213ps_fma(auVar7,auVar142,local_a60._0_16_);
                      auVar109 = vshufps_avx(auVar142,auVar142,0xc9);
                      auVar246 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                      auVar143._0_4_ = auVar142._0_4_ * auVar246._0_4_;
                      auVar143._4_4_ = auVar142._4_4_ * auVar246._4_4_;
                      auVar143._8_4_ = auVar142._8_4_ * auVar246._8_4_;
                      auVar143._12_4_ = auVar142._12_4_ * auVar246._12_4_;
                      auVar141 = vfmsub231ps_fma(auVar143,local_a60._0_16_,auVar109);
                      auVar109 = vshufps_avx(auVar141,auVar141,0xc9);
                      auVar246 = vshufps_avx(auVar7,auVar7,0xc9);
                      auVar141 = vshufps_avx(auVar141,auVar141,0xd2);
                      auVar107._0_4_ = auVar7._0_4_ * auVar141._0_4_;
                      auVar107._4_4_ = auVar7._4_4_ * auVar141._4_4_;
                      auVar107._8_4_ = auVar7._8_4_ * auVar141._8_4_;
                      auVar107._12_4_ = auVar7._12_4_ * auVar141._12_4_;
                      auVar109 = vfmsub231ps_fma(auVar107,auVar109,auVar246);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar267;
                        auVar246 = vshufps_avx(auVar109,auVar109,0xe9);
                        uVar1 = vmovlps_avx(auVar246);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                        (ray->Ng).field_0.field_0.z = auVar109._0_4_;
                        ray->u = fVar276;
                        ray->v = 0.0;
                        ray->primID = uVar92;
                        ray->geomID = (uint)local_b08;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar246 = vshufps_avx(auVar109,auVar109,0xe9);
                        local_9b0 = vmovlps_avx(auVar246);
                        local_9a8 = auVar109._0_4_;
                        local_9a4 = fVar276;
                        local_9a0 = 0;
                        local_99c = uVar92;
                        local_998 = (uint)local_b08;
                        local_994 = context->user->instID[0];
                        local_990 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar267;
                        local_b0c = -1;
                        local_a90.valid = &local_b0c;
                        local_a90.geometryUserPtr = pGVar5->userPtr;
                        local_a90.context = context->user;
                        local_a90.ray = (RTCRayN *)ray;
                        local_a90.hit = (RTCHitN *)&local_9b0;
                        local_a90.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar276);
                        local_b00._0_16_ = ZEXT416((uint)fVar267);
                        local_ac0._0_4_ = fVar277;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0165eb1f:
                          p_Var6 = context->args->filter;
                          fVar200 = (float)local_8a0._0_4_;
                          fVar213 = (float)local_8a0._4_4_;
                          fVar214 = fStack_898;
                          fVar216 = fStack_894;
                          fVar215 = fStack_890;
                          fVar235 = fStack_88c;
                          fVar217 = fStack_888;
                          if (p_Var6 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar228 = ZEXT1664(auVar228._0_16_);
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              auVar261 = ZEXT1664(auVar261._0_16_);
                              auVar294 = ZEXT1664(auVar294._0_16_);
                              (*p_Var6)(&local_a90);
                              auVar249 = ZEXT1664(local_ae0._0_16_);
                              auVar275 = ZEXT3264(local_880);
                              auVar266 = ZEXT3264(local_860);
                              fVar277 = (float)local_ac0._0_4_;
                              fVar267 = (float)local_b00._0_4_;
                              uVar94 = local_b00._4_4_;
                              uVar284 = local_b00._8_4_;
                              uVar286 = local_b00._12_4_;
                              fVar200 = (float)local_8a0._0_4_;
                              fVar213 = (float)local_8a0._4_4_;
                              fVar214 = fStack_898;
                              fVar216 = fStack_894;
                              fVar215 = fStack_890;
                              fVar235 = fStack_88c;
                              fVar217 = fStack_888;
                            }
                            if (*local_a90.valid == 0) goto LAB_0165ebde;
                          }
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a90.hit;
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a90.hit + 4);
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a90.hit + 8);
                          *(float *)((long)local_a90.ray + 0x3c) = *(float *)(local_a90.hit + 0xc);
                          *(float *)((long)local_a90.ray + 0x40) = *(float *)(local_a90.hit + 0x10);
                          *(float *)((long)local_a90.ray + 0x44) = *(float *)(local_a90.hit + 0x14);
                          *(float *)((long)local_a90.ray + 0x48) = *(float *)(local_a90.hit + 0x18);
                          *(float *)((long)local_a90.ray + 0x4c) = *(float *)(local_a90.hit + 0x1c);
                          *(float *)((long)local_a90.ray + 0x50) = *(float *)(local_a90.hit + 0x20);
                        }
                        else {
                          auVar228 = ZEXT1664(auVar258);
                          auVar234 = ZEXT1664(local_940._0_16_);
                          auVar261 = ZEXT1664(local_920._0_16_);
                          auVar294 = ZEXT1664(auVar294._0_16_);
                          (*pGVar5->intersectionFilterN)(&local_a90);
                          auVar249 = ZEXT1664(local_ae0._0_16_);
                          auVar275 = ZEXT3264(local_880);
                          auVar266 = ZEXT3264(local_860);
                          fVar277 = (float)local_ac0._0_4_;
                          fVar267 = (float)local_b00._0_4_;
                          uVar94 = local_b00._4_4_;
                          uVar284 = local_b00._8_4_;
                          uVar286 = local_b00._12_4_;
                          fVar200 = (float)local_8a0._0_4_;
                          fVar213 = (float)local_8a0._4_4_;
                          fVar214 = fStack_898;
                          fVar216 = fStack_894;
                          fVar215 = fStack_890;
                          fVar235 = fStack_88c;
                          fVar217 = fStack_888;
                          if (*local_a90.valid != 0) goto LAB_0165eb1f;
LAB_0165ebde:
                          (ray->super_RayK<1>).tfar = fVar277;
                        }
                      }
                    }
                  }
                }
                auVar124 = local_5e0;
                bVar97 = lVar96 != 0;
                lVar96 = lVar96 + -1;
              } while ((!bVar55) && (bVar97));
              fVar267 = (ray->super_RayK<1>).tfar;
              auVar125._4_4_ = fVar267;
              auVar125._0_4_ = fVar267;
              auVar125._8_4_ = fVar267;
              auVar125._12_4_ = fVar267;
              auVar125._16_4_ = fVar267;
              auVar125._20_4_ = fVar267;
              auVar125._24_4_ = fVar267;
              auVar125._28_4_ = fVar267;
              auVar160 = vcmpps_avx(_local_780,auVar125,2);
              local_5e0 = vandps_avx(auVar160,local_5e0);
              auVar212 = ZEXT3264(local_5e0);
              auVar124 = auVar124 & auVar160;
              uVar95 = local_640._0_8_;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
          }
          auVar129._0_4_ = fVar200 * (float)local_6a0._0_4_;
          auVar129._4_4_ = fVar213 * (float)local_6a0._4_4_;
          auVar129._8_4_ = fVar214 * fStack_698;
          auVar129._12_4_ = fVar216 * fStack_694;
          auVar129._16_4_ = fVar215 * fStack_690;
          auVar129._20_4_ = fVar235 * fStack_68c;
          auVar129._28_36_ = auVar212._28_36_;
          auVar129._24_4_ = fVar217 * fStack_688;
          auVar109 = vfmadd213ps_fma(local_680,auVar275._0_32_,auVar129._0_32_);
          auVar109 = vfmadd213ps_fma(local_660,auVar266._0_32_,ZEXT1632(auVar109));
          auVar69._4_4_ = uStack_79c;
          auVar69._0_4_ = local_7a0;
          auVar69._8_4_ = uStack_798;
          auVar69._12_4_ = uStack_794;
          auVar69._16_4_ = uStack_790;
          auVar69._20_4_ = uStack_78c;
          auVar69._24_4_ = uStack_788;
          auVar69._28_4_ = uStack_784;
          auVar124 = vandps_avx(ZEXT1632(auVar109),auVar69);
          auVar154._8_4_ = 0x3e99999a;
          auVar154._0_8_ = 0x3e99999a3e99999a;
          auVar154._12_4_ = 0x3e99999a;
          auVar154._16_4_ = 0x3e99999a;
          auVar154._20_4_ = 0x3e99999a;
          auVar154._24_4_ = 0x3e99999a;
          auVar154._28_4_ = 0x3e99999a;
          auVar124 = vcmpps_avx(auVar124,auVar154,1);
          auVar160 = vorps_avx(auVar124,local_260);
          auVar155._0_4_ = (float)local_5a0._0_4_ + (float)local_740._0_4_;
          auVar155._4_4_ = (float)local_5a0._4_4_ + (float)local_740._4_4_;
          auVar155._8_4_ = fStack_598 + fStack_738;
          auVar155._12_4_ = fStack_594 + fStack_734;
          auVar155._16_4_ = fStack_590 + fStack_730;
          auVar155._20_4_ = fStack_58c + fStack_72c;
          auVar155._24_4_ = fStack_588 + fStack_728;
          auVar155._28_4_ = fStack_584 + fStack_724;
          fVar200 = (ray->super_RayK<1>).tfar;
          auVar174._4_4_ = fVar200;
          auVar174._0_4_ = fVar200;
          auVar174._8_4_ = fVar200;
          auVar174._12_4_ = fVar200;
          auVar174._16_4_ = fVar200;
          auVar174._20_4_ = fVar200;
          auVar174._24_4_ = fVar200;
          auVar174._28_4_ = fVar200;
          auVar124 = vcmpps_avx(auVar155,auVar174,2);
          _local_760 = vandps_avx(auVar124,local_5c0);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar175._8_4_ = 2;
          auVar175._0_8_ = 0x200000002;
          auVar175._12_4_ = 2;
          auVar175._16_4_ = 2;
          auVar175._20_4_ = 2;
          auVar175._24_4_ = 2;
          auVar175._28_4_ = 2;
          auVar124 = vblendvps_avx(auVar175,auVar156,auVar160);
          _local_780 = vpcmpgtd_avx2(auVar124,local_280);
          local_600 = vpandn_avx2(_local_780,_local_760);
          auVar124 = _local_760 & ~_local_780;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            auVar246 = vminps_avx(local_a10,local_a30);
            auVar109 = vmaxps_avx(local_a10,local_a30);
            auVar258 = vminps_avx(local_a20,_local_a40);
            auVar141 = vminps_avx(auVar246,auVar258);
            auVar246 = vmaxps_avx(local_a20,_local_a40);
            auVar258 = vmaxps_avx(auVar109,auVar246);
            auVar109 = vandps_avx(auVar141,local_8d0);
            auVar246 = vandps_avx(auVar258,local_8d0);
            auVar109 = vmaxps_avx(auVar109,auVar246);
            auVar246 = vmovshdup_avx(auVar109);
            auVar246 = vmaxss_avx(auVar246,auVar109);
            auVar109 = vshufpd_avx(auVar109,auVar109,1);
            auVar109 = vmaxss_avx(auVar109,auVar246);
            local_820._0_4_ = auVar109._0_4_ * 1.9073486e-06;
            local_6e0._0_16_ = vshufps_avx(auVar258,auVar258,0xff);
            local_700 = _local_4a0;
            local_720._4_4_ = (float)local_4a0._4_4_ + (float)local_740._4_4_;
            local_720._0_4_ = (float)local_4a0._0_4_ + (float)local_740._0_4_;
            fStack_718 = fStack_498 + fStack_738;
            fStack_714 = fStack_494 + fStack_734;
            fStack_710 = fStack_490 + fStack_730;
            fStack_70c = fStack_48c + fStack_72c;
            fStack_708 = fStack_488 + fStack_728;
            fStack_704 = fStack_484 + fStack_724;
            do {
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar124 = vblendvps_avx(auVar157,local_700,local_600);
              auVar160 = vshufps_avx(auVar124,auVar124,0xb1);
              auVar160 = vminps_avx(auVar124,auVar160);
              auVar114 = vshufpd_avx(auVar160,auVar160,5);
              auVar160 = vminps_avx(auVar160,auVar114);
              auVar114 = vpermpd_avx2(auVar160,0x4e);
              auVar160 = vminps_avx(auVar160,auVar114);
              auVar160 = vcmpps_avx(auVar124,auVar160,0);
              auVar114 = local_600 & auVar160;
              auVar124 = local_600;
              if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar114 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar114 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar114 >> 0x7f,0) != '\0') ||
                    (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar114 >> 0xbf,0) != '\0') ||
                  (auVar114 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar114[0x1f] < '\0') {
                auVar124 = vandps_avx(auVar160,local_600);
              }
              uVar90 = vmovmskps_avx(auVar124);
              iVar13 = 0;
              for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
                iVar13 = iVar13 + 1;
              }
              uVar90 = iVar13 << 2;
              *(undefined4 *)(local_600 + uVar90) = 0;
              aVar2 = (ray->super_RayK<1>).dir.field_0;
              local_900._0_16_ = (undefined1  [16])aVar2;
              auVar109 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              auVar249 = ZEXT464(*(uint *)(local_500 + uVar90));
              auVar261 = ZEXT464(*(uint *)(local_480 + uVar90));
              if (auVar109._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_500 + uVar90));
                local_b00._0_16_ = ZEXT416(*(uint *)(local_480 + uVar90));
                fVar200 = sqrtf(auVar109._0_4_);
                auVar261 = ZEXT1664(local_b00._0_16_);
                auVar249 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar109 = vsqrtss_avx(auVar109,auVar109);
                fVar200 = auVar109._0_4_;
              }
              local_920._0_4_ = fVar200 * 1.9073486e-06;
              lVar96 = 4;
              do {
                fVar213 = auVar249._0_4_;
                fVar235 = 1.0 - fVar213;
                local_a60._0_16_ = ZEXT416((uint)fVar235);
                fVar216 = fVar235 * fVar235 * fVar235;
                fVar215 = fVar213 * fVar213;
                fVar214 = fVar213 * fVar215;
                auVar246 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar216),
                                           ZEXT416((uint)fVar214));
                fVar200 = fVar213 * fVar235;
                auVar258 = vfmadd231ss_fma(ZEXT416((uint)(fVar213 * fVar200 * 6.0)),
                                           ZEXT416((uint)(fVar235 * fVar200)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)(fVar235 * fVar200 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar213 * fVar200)));
                auVar109 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar214),
                                           ZEXT416((uint)fVar216));
                fVar213 = (auVar109._0_4_ + auVar141._0_4_) * 0.16666667;
                fVar214 = fVar214 * 0.16666667;
                auVar144._0_4_ = fVar214 * (float)local_a40._0_4_;
                auVar144._4_4_ = fVar214 * (float)local_a40._4_4_;
                auVar144._8_4_ = fVar214 * fStack_a38;
                auVar144._12_4_ = fVar214 * fStack_a34;
                auVar188._4_4_ = fVar213;
                auVar188._0_4_ = fVar213;
                auVar188._8_4_ = fVar213;
                auVar188._12_4_ = fVar213;
                auVar109 = vfmadd132ps_fma(auVar188,auVar144,local_a20);
                fVar213 = (auVar246._0_4_ + auVar258._0_4_) * 0.16666667;
                auVar145._4_4_ = fVar213;
                auVar145._0_4_ = fVar213;
                auVar145._8_4_ = fVar213;
                auVar145._12_4_ = fVar213;
                auVar109 = vfmadd132ps_fma(auVar145,auVar109,local_a30);
                uVar94 = auVar261._0_4_;
                auVar168._4_4_ = uVar94;
                auVar168._0_4_ = uVar94;
                auVar168._8_4_ = uVar94;
                auVar168._12_4_ = uVar94;
                auVar246 = vfmadd213ps_fma(auVar168,local_900._0_16_,_DAT_01feba10);
                fVar216 = fVar216 * 0.16666667;
                auVar108._4_4_ = fVar216;
                auVar108._0_4_ = fVar216;
                auVar108._8_4_ = fVar216;
                auVar108._12_4_ = fVar216;
                auVar109 = vfmadd132ps_fma(auVar108,auVar109,local_a10);
                local_6c0._0_16_ = auVar109;
                auVar109 = vsubps_avx(auVar246,auVar109);
                _local_980 = auVar109;
                auVar109 = vdpps_avx(auVar109,auVar109,0x7f);
                local_ae0._0_16_ = auVar249._0_16_;
                local_b00._0_16_ = auVar261._0_16_;
                local_ac0._0_16_ = auVar109;
                if (auVar109._0_4_ < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar235);
                  local_9e0._0_4_ = fVar215;
                  local_a00._0_4_ = fVar200;
                  auVar294._0_4_ = sqrtf(auVar109._0_4_);
                  auVar294._4_60_ = extraout_var_00;
                  auVar109 = auVar294._0_16_;
                  fVar200 = (float)local_a00._0_4_;
                  fVar215 = (float)local_9e0._0_4_;
                  auVar246 = local_ae0._0_16_;
                  auVar258 = local_b00._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar109,auVar109);
                  auVar246 = auVar249._0_16_;
                  auVar258 = auVar261._0_16_;
                }
                fVar213 = local_a60._0_4_;
                auVar110._4_4_ = fVar213;
                auVar110._0_4_ = fVar213;
                auVar110._8_4_ = fVar213;
                auVar110._12_4_ = fVar213;
                auVar7 = vfnmsub213ss_fma(auVar246,auVar246,ZEXT416((uint)(fVar200 * 4.0)));
                auVar141 = vfmadd231ss_fma(ZEXT416((uint)(fVar200 * 4.0)),local_a60._0_16_,
                                           local_a60._0_16_);
                fVar200 = fVar213 * -fVar213 * 0.5;
                fVar213 = auVar7._0_4_ * 0.5;
                fVar214 = auVar141._0_4_ * 0.5;
                fVar215 = fVar215 * 0.5;
                auVar225._0_4_ = (float)local_a40._0_4_ * fVar215;
                auVar225._4_4_ = (float)local_a40._4_4_ * fVar215;
                auVar225._8_4_ = fStack_a38 * fVar215;
                auVar225._12_4_ = fStack_a34 * fVar215;
                auVar189._4_4_ = fVar214;
                auVar189._0_4_ = fVar214;
                auVar189._8_4_ = fVar214;
                auVar189._12_4_ = fVar214;
                auVar141 = vfmadd213ps_fma(auVar189,local_a20,auVar225);
                auVar206._4_4_ = fVar213;
                auVar206._0_4_ = fVar213;
                auVar206._8_4_ = fVar213;
                auVar206._12_4_ = fVar213;
                auVar141 = vfmadd213ps_fma(auVar206,local_a30,auVar141);
                auVar264._4_4_ = fVar200;
                auVar264._0_4_ = fVar200;
                auVar264._8_4_ = fVar200;
                auVar264._12_4_ = fVar200;
                auVar8 = vfmadd213ps_fma(auVar264,local_a10,auVar141);
                auVar141 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar246)
                ;
                auVar7 = vfmadd231ss_fma(local_a60._0_16_,auVar246,SUB6416(ZEXT464(0xc0000000),0));
                fVar200 = auVar246._0_4_;
                auVar190._0_4_ = (float)local_a40._0_4_ * fVar200;
                auVar190._4_4_ = (float)local_a40._4_4_ * fVar200;
                auVar190._8_4_ = fStack_a38 * fVar200;
                auVar190._12_4_ = fStack_a34 * fVar200;
                uVar94 = auVar7._0_4_;
                auVar207._4_4_ = uVar94;
                auVar207._0_4_ = uVar94;
                auVar207._8_4_ = uVar94;
                auVar207._12_4_ = uVar94;
                auVar246 = vfmadd213ps_fma(auVar207,local_a20,auVar190);
                auVar169._0_4_ = auVar141._0_4_;
                auVar169._4_4_ = auVar169._0_4_;
                auVar169._8_4_ = auVar169._0_4_;
                auVar169._12_4_ = auVar169._0_4_;
                auVar246 = vfmadd213ps_fma(auVar169,local_a30,auVar246);
                auVar102 = vfmadd231ps_fma(auVar246,local_a10,auVar110);
                auVar141 = vdpps_avx(auVar8,auVar8,0x7f);
                auVar246 = vblendps_avx(auVar141,_DAT_01feba10,0xe);
                auVar7 = vrsqrtss_avx(auVar246,auVar246);
                fVar200 = auVar7._0_4_;
                fVar214 = auVar141._0_4_;
                fVar200 = fVar200 * 1.5 + fVar214 * -0.5 * fVar200 * fVar200 * fVar200;
                auVar7 = vdpps_avx(auVar8,auVar102,0x7f);
                auVar170._0_4_ = auVar102._0_4_ * fVar214;
                auVar170._4_4_ = auVar102._4_4_ * fVar214;
                auVar170._8_4_ = auVar102._8_4_ * fVar214;
                auVar170._12_4_ = auVar102._12_4_ * fVar214;
                fVar213 = auVar7._0_4_;
                auVar226._0_4_ = auVar8._0_4_ * fVar213;
                auVar226._4_4_ = auVar8._4_4_ * fVar213;
                fVar216 = auVar8._8_4_;
                auVar226._8_4_ = fVar216 * fVar213;
                fVar215 = auVar8._12_4_;
                auVar226._12_4_ = fVar215 * fVar213;
                auVar7 = vsubps_avx(auVar170,auVar226);
                auVar246 = vrcpss_avx(auVar246,auVar246);
                auVar102 = vfnmadd213ss_fma(auVar246,auVar141,ZEXT416(0x40000000));
                fVar213 = auVar246._0_4_ * auVar102._0_4_;
                auVar246 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar258._0_4_ * (float)local_920._0_4_)));
                auVar212 = ZEXT1664(auVar246);
                auVar231._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
                auVar231._8_4_ = -fVar216;
                auVar231._12_4_ = -fVar215;
                auVar191._0_4_ = fVar200 * auVar7._0_4_ * fVar213;
                auVar191._4_4_ = fVar200 * auVar7._4_4_ * fVar213;
                auVar191._8_4_ = fVar200 * auVar7._8_4_ * fVar213;
                auVar191._12_4_ = fVar200 * auVar7._12_4_ * fVar213;
                auVar248._0_4_ = auVar8._0_4_ * fVar200;
                auVar248._4_4_ = auVar8._4_4_ * fVar200;
                auVar248._8_4_ = fVar216 * fVar200;
                auVar248._12_4_ = fVar215 * fVar200;
                local_a60._0_16_ = auVar8;
                local_9e0._0_4_ = auVar246._0_4_;
                if (fVar214 < -fVar214) {
                  local_a00._0_4_ = auVar109._0_4_;
                  local_940._0_16_ = auVar231;
                  local_960._0_16_ = auVar248;
                  local_840._0_16_ = auVar191;
                  fVar200 = sqrtf(fVar214);
                  auVar212 = ZEXT464((uint)local_9e0._0_4_);
                  auVar109 = ZEXT416((uint)local_a00._0_4_);
                  auVar191 = local_840._0_16_;
                  auVar231 = local_940._0_16_;
                  auVar248 = local_960._0_16_;
                }
                else {
                  auVar246 = vsqrtss_avx(auVar141,auVar141);
                  fVar200 = auVar246._0_4_;
                }
                auVar246 = vdpps_avx(_local_980,auVar248,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar109,auVar212._0_16_);
                auVar258 = vdpps_avx(auVar231,auVar248,0x7f);
                auVar141 = vdpps_avx(_local_980,auVar191,0x7f);
                auVar7 = vdpps_avx(local_900._0_16_,auVar248,0x7f);
                auVar8 = vfmadd213ss_fma(ZEXT416((uint)(auVar109._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_820._0_4_ / fVar200)),auVar8);
                auVar275 = ZEXT1664(auVar8);
                fVar200 = auVar258._0_4_ + auVar141._0_4_;
                auVar111._0_4_ = auVar246._0_4_ * auVar246._0_4_;
                auVar111._4_4_ = auVar246._4_4_ * auVar246._4_4_;
                auVar111._8_4_ = auVar246._8_4_ * auVar246._8_4_;
                auVar111._12_4_ = auVar246._12_4_ * auVar246._12_4_;
                auVar109 = vdpps_avx(_local_980,auVar231,0x7f);
                auVar141 = vsubps_avx(local_ac0._0_16_,auVar111);
                auVar258 = vrsqrtss_avx(auVar141,auVar141);
                fVar214 = auVar141._0_4_;
                fVar213 = auVar258._0_4_;
                fVar213 = fVar213 * 1.5 + fVar214 * -0.5 * fVar213 * fVar213 * fVar213;
                auVar258 = vdpps_avx(_local_980,local_900._0_16_,0x7f);
                auVar109 = vfnmadd231ss_fma(auVar109,auVar246,ZEXT416((uint)fVar200));
                auVar258 = vfnmadd231ss_fma(auVar258,auVar246,auVar7);
                if (fVar214 < 0.0) {
                  local_a00._0_16_ = auVar246;
                  local_940._0_4_ = auVar8._0_4_;
                  local_960._0_16_ = ZEXT416((uint)fVar200);
                  local_840._0_16_ = auVar7;
                  local_860._0_16_ = auVar109;
                  local_880._0_4_ = fVar213;
                  _local_8a0 = auVar258;
                  fVar214 = sqrtf(fVar214);
                  auVar275 = ZEXT464((uint)local_940._0_4_);
                  auVar212 = ZEXT464((uint)local_9e0._0_4_);
                  fVar213 = (float)local_880._0_4_;
                  auVar258 = _local_8a0;
                  auVar246 = local_a00._0_16_;
                  auVar7 = local_840._0_16_;
                  auVar109 = local_860._0_16_;
                  auVar141 = local_960._0_16_;
                }
                else {
                  auVar141 = vsqrtss_avx(auVar141,auVar141);
                  fVar214 = auVar141._0_4_;
                  auVar141 = ZEXT416((uint)fVar200);
                }
                auVar266 = ZEXT1664(auVar246);
                auVar234 = ZEXT1664(local_a60._0_16_);
                auVar102 = vpermilps_avx(local_6c0._0_16_,0xff);
                auVar8 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xff);
                auVar101 = vfmsub213ss_fma(auVar109,ZEXT416((uint)fVar213),auVar8);
                auVar294 = ZEXT1664(auVar101);
                auVar192._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
                auVar192._8_4_ = auVar7._8_4_ ^ 0x80000000;
                auVar192._12_4_ = auVar7._12_4_ ^ 0x80000000;
                auVar208._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
                auVar208._8_4_ = auVar101._8_4_ ^ 0x80000000;
                auVar208._12_4_ = auVar101._12_4_ ^ 0x80000000;
                auVar109 = ZEXT416((uint)(auVar258._0_4_ * fVar213));
                auVar258 = vfmsub231ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar101._0_4_)),auVar141,
                                           auVar109);
                auVar109 = vinsertps_avx(auVar109,auVar192,0x10);
                uVar94 = auVar258._0_4_;
                auVar193._4_4_ = uVar94;
                auVar193._0_4_ = uVar94;
                auVar193._8_4_ = uVar94;
                auVar193._12_4_ = uVar94;
                auVar109 = vdivps_avx(auVar109,auVar193);
                auVar102 = ZEXT416((uint)(fVar214 - auVar102._0_4_));
                auVar7 = vinsertps_avx(auVar246,auVar102,0x10);
                auVar228 = ZEXT1664(auVar7);
                auVar171._0_4_ = auVar7._0_4_ * auVar109._0_4_;
                auVar171._4_4_ = auVar7._4_4_ * auVar109._4_4_;
                auVar171._8_4_ = auVar7._8_4_ * auVar109._8_4_;
                auVar171._12_4_ = auVar7._12_4_ * auVar109._12_4_;
                auVar109 = vinsertps_avx(auVar208,auVar141,0x1c);
                auVar109 = vdivps_avx(auVar109,auVar193);
                auVar194._0_4_ = auVar7._0_4_ * auVar109._0_4_;
                auVar194._4_4_ = auVar7._4_4_ * auVar109._4_4_;
                auVar194._8_4_ = auVar7._8_4_ * auVar109._8_4_;
                auVar194._12_4_ = auVar7._12_4_ * auVar109._12_4_;
                auVar109 = vhaddps_avx(auVar171,auVar171);
                auVar258 = vhaddps_avx(auVar194,auVar194);
                fVar213 = (float)local_ae0._0_4_ - auVar109._0_4_;
                auVar249 = ZEXT464((uint)fVar213);
                fVar200 = (float)local_b00._0_4_ - auVar258._0_4_;
                auVar261 = ZEXT464((uint)fVar200);
                auVar109 = vandps_avx(auVar246,local_8d0);
                if (auVar275._0_4_ <= auVar109._0_4_) {
LAB_0165f4bb:
                  bVar55 = false;
                }
                else {
                  auVar258 = vfmadd231ss_fma(ZEXT416((uint)(auVar212._0_4_ + auVar275._0_4_)),
                                             local_6e0._0_16_,ZEXT416(0x36000000));
                  auVar109 = vandps_avx(auVar102,local_8d0);
                  if (auVar258._0_4_ <= auVar109._0_4_) goto LAB_0165f4bb;
                  fVar200 = fVar200 + (float)local_7f0._0_4_;
                  auVar261 = ZEXT464((uint)fVar200);
                  bVar55 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar200) &&
                       (fVar214 = (ray->super_RayK<1>).tfar, fVar200 <= fVar214)) &&
                      (0.0 <= fVar213)) && (fVar213 <= 1.0)) {
                    auVar109 = vrsqrtss_avx(local_ac0._0_16_,local_ac0._0_16_);
                    fVar216 = auVar109._0_4_;
                    pGVar5 = (context->scene->geometries).items[local_b08].ptr;
                    if ((pGVar5->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar216 = fVar216 * 1.5 + local_ac0._0_4_ * -0.5 * fVar216 * fVar216 * fVar216
                      ;
                      auVar146._0_4_ = fVar216 * (float)local_980._0_4_;
                      auVar146._4_4_ = fVar216 * (float)local_980._4_4_;
                      auVar146._8_4_ = fVar216 * fStack_978;
                      auVar146._12_4_ = fVar216 * fStack_974;
                      auVar8 = vfmadd213ps_fma(auVar8,auVar146,local_a60._0_16_);
                      auVar109 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar258 = vshufps_avx(local_a60._0_16_,local_a60._0_16_,0xc9);
                      auVar147._0_4_ = auVar146._0_4_ * auVar258._0_4_;
                      auVar147._4_4_ = auVar146._4_4_ * auVar258._4_4_;
                      auVar147._8_4_ = auVar146._8_4_ * auVar258._8_4_;
                      auVar147._12_4_ = auVar146._12_4_ * auVar258._12_4_;
                      auVar141 = vfmsub231ps_fma(auVar147,local_a60._0_16_,auVar109);
                      auVar109 = vshufps_avx(auVar141,auVar141,0xc9);
                      auVar258 = vshufps_avx(auVar8,auVar8,0xc9);
                      auVar141 = vshufps_avx(auVar141,auVar141,0xd2);
                      auVar112._0_4_ = auVar8._0_4_ * auVar141._0_4_;
                      auVar112._4_4_ = auVar8._4_4_ * auVar141._4_4_;
                      auVar112._8_4_ = auVar8._8_4_ * auVar141._8_4_;
                      auVar112._12_4_ = auVar8._12_4_ * auVar141._12_4_;
                      auVar109 = vfmsub231ps_fma(auVar112,auVar109,auVar258);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar200;
                        auVar246 = vshufps_avx(auVar109,auVar109,0xe9);
                        uVar1 = vmovlps_avx(auVar246);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar1;
                        (ray->Ng).field_0.field_0.z = auVar109._0_4_;
                        ray->u = fVar213;
                        ray->v = 0.0;
                        ray->primID = uVar92;
                        ray->geomID = (uint)local_b08;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar258 = vshufps_avx(auVar109,auVar109,0xe9);
                        local_9b0 = vmovlps_avx(auVar258);
                        local_9a8 = auVar109._0_4_;
                        local_9a4 = fVar213;
                        local_9a0 = 0;
                        local_99c = uVar92;
                        local_998 = (uint)local_b08;
                        local_994 = context->user->instID[0];
                        local_990 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar200;
                        local_b0c = -1;
                        local_a90.valid = &local_b0c;
                        local_a90.geometryUserPtr = pGVar5->userPtr;
                        local_a90.context = context->user;
                        local_a90.ray = (RTCRayN *)ray;
                        local_a90.hit = (RTCHitN *)&local_9b0;
                        local_a90.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar213);
                        local_b00._0_16_ = ZEXT416((uint)fVar200);
                        local_ac0._0_4_ = fVar214;
                        if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0165f5df:
                          p_Var6 = context->args->filter;
                          if (p_Var6 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                              auVar228 = ZEXT1664(auVar228._0_16_);
                              auVar234 = ZEXT1664(auVar234._0_16_);
                              auVar266 = ZEXT1664(auVar266._0_16_);
                              auVar275 = ZEXT1664(auVar275._0_16_);
                              auVar294 = ZEXT1664(auVar294._0_16_);
                              (*p_Var6)(&local_a90);
                              auVar261 = ZEXT1664(local_b00._0_16_);
                              auVar249 = ZEXT1664(local_ae0._0_16_);
                              fVar214 = (float)local_ac0._0_4_;
                            }
                            if (*local_a90.valid == 0) goto LAB_0165f683;
                          }
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a90.hit;
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a90.hit + 4);
                          (((Vec3f *)((long)local_a90.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a90.hit + 8);
                          *(float *)((long)local_a90.ray + 0x3c) = *(float *)(local_a90.hit + 0xc);
                          *(float *)((long)local_a90.ray + 0x40) = *(float *)(local_a90.hit + 0x10);
                          *(float *)((long)local_a90.ray + 0x44) = *(float *)(local_a90.hit + 0x14);
                          *(float *)((long)local_a90.ray + 0x48) = *(float *)(local_a90.hit + 0x18);
                          *(float *)((long)local_a90.ray + 0x4c) = *(float *)(local_a90.hit + 0x1c);
                          *(float *)((long)local_a90.ray + 0x50) = *(float *)(local_a90.hit + 0x20);
                        }
                        else {
                          auVar228 = ZEXT1664(auVar7);
                          auVar234 = ZEXT1664(local_a60._0_16_);
                          auVar266 = ZEXT1664(auVar246);
                          auVar275 = ZEXT1664(auVar275._0_16_);
                          auVar294 = ZEXT1664(auVar101);
                          (*pGVar5->intersectionFilterN)(&local_a90);
                          auVar261 = ZEXT1664(local_b00._0_16_);
                          auVar249 = ZEXT1664(local_ae0._0_16_);
                          fVar214 = (float)local_ac0._0_4_;
                          if (*local_a90.valid != 0) goto LAB_0165f5df;
LAB_0165f683:
                          (ray->super_RayK<1>).tfar = fVar214;
                        }
                      }
                    }
                  }
                }
                auVar124 = local_600;
                bVar97 = lVar96 != 0;
                lVar96 = lVar96 + -1;
              } while ((!bVar55) && (bVar97));
              fVar200 = (ray->super_RayK<1>).tfar;
              auVar126._4_4_ = fVar200;
              auVar126._0_4_ = fVar200;
              auVar126._8_4_ = fVar200;
              auVar126._12_4_ = fVar200;
              auVar126._16_4_ = fVar200;
              auVar126._20_4_ = fVar200;
              auVar126._24_4_ = fVar200;
              auVar126._28_4_ = fVar200;
              auVar160 = vcmpps_avx(_local_720,auVar126,2);
              local_600 = vandps_avx(auVar160,local_600);
              auVar124 = auVar124 & auVar160;
              uVar95 = local_640._0_8_;
            } while ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar124 >> 0x7f,0) != '\0') ||
                       (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar124 >> 0xbf,0) != '\0') ||
                     (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar124[0x1f] < '\0');
          }
          auVar158._0_4_ = (float)local_740._0_4_ + local_460._0_4_;
          auVar158._4_4_ = (float)local_740._4_4_ + local_460._4_4_;
          auVar158._8_4_ = fStack_738 + local_460._8_4_;
          auVar158._12_4_ = fStack_734 + local_460._12_4_;
          auVar158._16_4_ = fStack_730 + local_460._16_4_;
          auVar158._20_4_ = fStack_72c + local_460._20_4_;
          auVar158._24_4_ = fStack_728 + local_460._24_4_;
          auVar158._28_4_ = fStack_724 + local_460._28_4_;
          fVar200 = (ray->super_RayK<1>).tfar;
          auVar198._4_4_ = fVar200;
          auVar198._0_4_ = fVar200;
          auVar198._8_4_ = fVar200;
          auVar198._12_4_ = fVar200;
          auVar198._16_4_ = fVar200;
          auVar198._20_4_ = fVar200;
          auVar198._24_4_ = fVar200;
          auVar198._28_4_ = fVar200;
          auVar160 = vcmpps_avx(auVar158,auVar198,2);
          auVar124 = vandps_avx(local_580,local_7c0);
          auVar124 = vandps_avx(auVar160,auVar124);
          auVar210._0_4_ = (float)local_740._0_4_ + local_4a0._0_4_;
          auVar210._4_4_ = (float)local_740._4_4_ + local_4a0._4_4_;
          auVar210._8_4_ = fStack_738 + local_4a0._8_4_;
          auVar210._12_4_ = fStack_734 + local_4a0._12_4_;
          auVar210._16_4_ = fStack_730 + local_4a0._16_4_;
          auVar210._20_4_ = fStack_72c + local_4a0._20_4_;
          auVar210._24_4_ = fStack_728 + local_4a0._24_4_;
          auVar210._28_4_ = fStack_724 + local_4a0._28_4_;
          auVar114 = vcmpps_avx(auVar210,auVar198,2);
          auVar160 = vandps_avx(_local_780,_local_760);
          auVar160 = vandps_avx(auVar114,auVar160);
          auVar160 = vorps_avx(auVar124,auVar160);
          if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0x7f,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0xbf,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar160[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar160;
            auVar124 = vblendvps_avx(_local_4a0,local_460,auVar124);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar124;
            auVar64._8_8_ = uStack_7f8;
            auVar64._0_8_ = local_800;
            uVar1 = vmovlps_avx(auVar64);
            *(undefined8 *)(afStack_140 + uVar91 * 0x18) = uVar1;
            auStack_138[uVar91 * 0x18] = (int)uVar95 + 1;
            uVar91 = (ulong)((int)uVar91 + 1);
          }
        }
      }
    }
    fVar200 = (ray->super_RayK<1>).tfar;
    auVar127._4_4_ = fVar200;
    auVar127._0_4_ = fVar200;
    auVar127._8_4_ = fVar200;
    auVar127._12_4_ = fVar200;
    auVar127._16_4_ = fVar200;
    auVar127._20_4_ = fVar200;
    auVar127._24_4_ = fVar200;
    auVar127._28_4_ = fVar200;
    do {
      if ((int)uVar91 == 0) {
        fVar200 = (ray->super_RayK<1>).tfar;
        auVar113._4_4_ = fVar200;
        auVar113._0_4_ = fVar200;
        auVar113._8_4_ = fVar200;
        auVar113._12_4_ = fVar200;
        auVar109 = vcmpps_avx(local_4b0,auVar113,2);
        uVar92 = vmovmskps_avx(auVar109);
        uVar92 = (uint)local_7c8 & uVar92;
        if (uVar92 == 0) {
          return;
        }
        goto LAB_0165d27f;
      }
      uVar93 = (ulong)((int)uVar91 - 1);
      lVar96 = uVar93 * 0x60;
      auVar124 = *(undefined1 (*) [32])(auStack_160 + lVar96);
      auVar159._0_4_ = auVar124._0_4_ + (float)local_740._0_4_;
      auVar159._4_4_ = auVar124._4_4_ + (float)local_740._4_4_;
      auVar159._8_4_ = auVar124._8_4_ + fStack_738;
      auVar159._12_4_ = auVar124._12_4_ + fStack_734;
      auVar159._16_4_ = auVar124._16_4_ + fStack_730;
      auVar159._20_4_ = auVar124._20_4_ + fStack_72c;
      auVar159._24_4_ = auVar124._24_4_ + fStack_728;
      auVar159._28_4_ = auVar124._28_4_ + fStack_724;
      auVar114 = vcmpps_avx(auVar159,auVar127,2);
      auVar160 = vandps_avx(auVar114,*(undefined1 (*) [32])(auStack_180 + lVar96));
      local_460 = auVar160;
      auVar9 = *(undefined1 (*) [32])(auStack_180 + lVar96) & auVar114;
      bVar61 = (auVar9 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = (auVar9 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = (auVar9 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar59 = SUB321(auVar9 >> 0x7f,0) == '\0';
      bVar58 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar57 = SUB321(auVar9 >> 0xbf,0) == '\0';
      bVar97 = (auVar9 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = -1 < auVar9[0x1f];
      if (((((((!bVar61 || !bVar62) || !bVar60) || !bVar59) || !bVar58) || !bVar57) || !bVar97) ||
          !bVar55) {
        auVar199._8_4_ = 0x7f800000;
        auVar199._0_8_ = 0x7f8000007f800000;
        auVar199._12_4_ = 0x7f800000;
        auVar199._16_4_ = 0x7f800000;
        auVar199._20_4_ = 0x7f800000;
        auVar199._24_4_ = 0x7f800000;
        auVar199._28_4_ = 0x7f800000;
        auVar124 = vblendvps_avx(auVar199,auVar124,auVar160);
        auVar114 = vshufps_avx(auVar124,auVar124,0xb1);
        auVar114 = vminps_avx(auVar124,auVar114);
        auVar9 = vshufpd_avx(auVar114,auVar114,5);
        auVar9 = vminps_avx(auVar114,auVar9);
        auVar114 = vpermpd_avx2(auVar9,0x4e);
        auVar9 = vminps_avx(auVar9,auVar114);
        auVar124 = vcmpps_avx(auVar124,auVar9,0);
        auVar9 = auVar160 & auVar124;
        if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar9 >> 0x7f,0) != '\0') ||
              (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0xbf,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar9[0x1f] < '\0') {
          auVar160 = vandps_avx(auVar124,auVar160);
        }
        fVar200 = afStack_140[uVar93 * 0x18 + 1];
        uVar95 = (ulong)auStack_138[uVar93 * 0x18];
        uVar90 = vmovmskps_avx(auVar160);
        iVar13 = 0;
        for (; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000) {
          iVar13 = iVar13 + 1;
        }
        fVar213 = afStack_140[uVar93 * 0x18];
        auVar161._4_4_ = fVar213;
        auVar161._0_4_ = fVar213;
        auVar161._8_4_ = fVar213;
        auVar161._12_4_ = fVar213;
        auVar161._16_4_ = fVar213;
        auVar161._20_4_ = fVar213;
        auVar161._24_4_ = fVar213;
        auVar161._28_4_ = fVar213;
        *(undefined4 *)(local_460 + (uint)(iVar13 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar96) = local_460;
        if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_460 >> 0x7f,0) != '\0') ||
              (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_460 >> 0xbf,0) != '\0') ||
            (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_460[0x1f] < '\0') {
          uVar93 = uVar91;
        }
        fVar200 = fVar200 - fVar213;
        auVar176._4_4_ = fVar200;
        auVar176._0_4_ = fVar200;
        auVar176._8_4_ = fVar200;
        auVar176._12_4_ = fVar200;
        auVar176._16_4_ = fVar200;
        auVar176._20_4_ = fVar200;
        auVar176._24_4_ = fVar200;
        auVar176._28_4_ = fVar200;
        auVar109 = vfmadd132ps_fma(auVar176,auVar161,_DAT_02020f20);
        _local_4a0 = ZEXT1632(auVar109);
        local_800 = *(undefined8 *)(local_4a0 + (uint)(iVar13 << 2));
        uStack_7f8 = 0;
      }
      uVar91 = uVar93;
      auVar212 = ZEXT3264(auVar114);
    } while (((((((bVar61 && bVar62) && bVar60) && bVar59) && bVar58) && bVar57) && bVar97) &&
             bVar55);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }